

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  BBox1f BVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  undefined4 uVar63;
  undefined8 unaff_RBP;
  long lVar64;
  long lVar65;
  bool bVar66;
  bool bVar67;
  float fVar68;
  float fVar94;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar96;
  undefined8 uVar97;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar138;
  float fVar139;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar140;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar144;
  float fVar162;
  float fVar163;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar142;
  float fVar164;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar143;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 bi;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar223;
  float fVar237;
  float fVar239;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar238;
  float fVar240;
  undefined1 auVar236 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar251 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar299 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar337;
  float fVar338;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar339;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [32];
  vfloat_impl<4> p00;
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  float fVar200;
  float fVar221;
  undefined1 auVar335 [32];
  
  p00.field_0.i[0]._0_1_ = prim[1];
  uVar58 = (ulong)(byte)p00.field_0.i[0]._0_1_;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  lVar64 = uVar58 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)p00.field_0.i[0]._0_1_ * 0x10 + 6)))
  ;
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x11 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar124 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + lVar64 + 6));
  fVar68 = *(float *)(prim + lVar64 + 0x12);
  fVar141 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar64 + 0x16)) *
            *(float *)(prim + lVar64 + 0x1a);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar274._0_4_ = fVar68 * auVar124._0_4_;
  auVar274._4_4_ = fVar68 * auVar124._4_4_;
  auVar274._8_4_ = fVar68 * auVar124._8_4_;
  auVar274._12_4_ = fVar68 * auVar124._12_4_;
  auVar307._0_4_ = fVar68 * auVar16._0_4_;
  auVar307._4_4_ = fVar68 * auVar16._4_4_;
  auVar307._8_4_ = fVar68 * auVar16._8_4_;
  auVar307._12_4_ = fVar68 * auVar16._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar22 = vcvtdq2ps_avx(auVar187);
  auVar187 = vcvtdq2ps_avx(auVar24);
  auVar24 = vshufps_avx(auVar307,auVar307,0x55);
  auVar124 = vshufps_avx(auVar307,auVar307,0xaa);
  fVar68 = auVar124._0_4_;
  auVar192._0_4_ = fVar68 * auVar19._0_4_;
  fVar94 = auVar124._4_4_;
  auVar192._4_4_ = fVar94 * auVar19._4_4_;
  fVar96 = auVar124._8_4_;
  auVar192._8_4_ = fVar96 * auVar19._8_4_;
  fVar144 = auVar124._12_4_;
  auVar192._12_4_ = fVar144 * auVar19._12_4_;
  auVar260._0_4_ = fVar68 * auVar21._0_4_;
  auVar260._4_4_ = fVar94 * auVar21._4_4_;
  auVar260._8_4_ = fVar96 * auVar21._8_4_;
  auVar260._12_4_ = fVar144 * auVar21._12_4_;
  auVar244._0_4_ = fVar68 * auVar187._0_4_;
  auVar244._4_4_ = fVar94 * auVar187._4_4_;
  auVar244._8_4_ = fVar96 * auVar187._8_4_;
  auVar244._12_4_ = fVar144 * auVar187._12_4_;
  auVar69 = vfmadd231ps_fma(auVar192,auVar24,auVar16);
  auVar70 = vfmadd231ps_fma(auVar260,auVar24,auVar20);
  auVar99 = vfmadd231ps_fma(auVar244,auVar22,auVar24);
  auVar24 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar68 = auVar24._0_4_;
  auVar165._0_4_ = fVar68 * auVar19._0_4_;
  fVar94 = auVar24._4_4_;
  auVar165._4_4_ = fVar94 * auVar19._4_4_;
  fVar96 = auVar24._8_4_;
  auVar165._8_4_ = fVar96 * auVar19._8_4_;
  fVar144 = auVar24._12_4_;
  auVar165._12_4_ = fVar144 * auVar19._12_4_;
  auVar145._0_4_ = fVar68 * auVar21._0_4_;
  auVar145._4_4_ = fVar94 * auVar21._4_4_;
  auVar145._8_4_ = fVar96 * auVar21._8_4_;
  auVar145._12_4_ = fVar144 * auVar21._12_4_;
  auVar328._0_4_ = auVar187._0_4_ * fVar68;
  auVar328._4_4_ = auVar187._4_4_ * fVar94;
  auVar328._8_4_ = auVar187._8_4_ * fVar96;
  auVar328._12_4_ = auVar187._12_4_ * fVar144;
  auVar21 = vshufps_avx(auVar274,auVar274,0x55);
  auVar187 = vfmadd231ps_fma(auVar165,auVar21,auVar16);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar24 = vpmovsxwd_avx(auVar16);
  auVar100 = vfmadd231ps_fma(auVar145,auVar21,auVar20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar124 = vpmovsxwd_avx(auVar19);
  auVar123 = vfmadd231ps_fma(auVar328,auVar21,auVar22);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar148 = vpmovsxwd_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar184);
  auVar20 = vcvtdq2ps_avx(auVar23);
  auVar291._4_4_ = auVar307._0_4_;
  auVar291._0_4_ = auVar307._0_4_;
  auVar291._8_4_ = auVar307._0_4_;
  auVar291._12_4_ = auVar307._0_4_;
  auVar23 = vfmadd231ps_fma(auVar69,auVar291,auVar16);
  auVar69 = vfmadd231ps_fma(auVar70,auVar291,auVar19);
  auVar70 = vfmadd231ps_fma(auVar99,auVar20,auVar291);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar18 = vpmovsxwd_avx(auVar21);
  auVar275._4_4_ = auVar274._0_4_;
  auVar275._0_4_ = auVar274._0_4_;
  auVar275._8_4_ = auVar274._0_4_;
  auVar275._12_4_ = auVar274._0_4_;
  auVar99 = vfmadd231ps_fma(auVar187,auVar275,auVar16);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar184 = vpmovsxwd_avx(auVar22);
  auVar100 = vfmadd231ps_fma(auVar100,auVar275,auVar19);
  auVar123 = vfmadd231ps_fma(auVar123,auVar275,auVar20);
  local_3e8._8_4_ = 0x7fffffff;
  local_3e8._0_8_ = 0x7fffffff7fffffff;
  local_3e8._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar23,local_3e8);
  auVar276._8_4_ = 0x219392ef;
  auVar276._0_8_ = 0x219392ef219392ef;
  auVar276._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar276,1);
  auVar19 = vblendvps_avx(auVar23,auVar276,auVar16);
  auVar16 = vandps_avx(auVar69,local_3e8);
  auVar16 = vcmpps_avx(auVar16,auVar276,1);
  auVar20 = vblendvps_avx(auVar69,auVar276,auVar16);
  auVar16 = vandps_avx(auVar70,local_3e8);
  auVar16 = vcmpps_avx(auVar16,auVar276,1);
  auVar16 = vblendvps_avx(auVar70,auVar276,auVar16);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar58 * 0x16 + 6);
  auVar187 = vpmovsxwd_avx(auVar187);
  auVar299._4_4_ = fVar141;
  auVar299._0_4_ = fVar141;
  auVar299._8_4_ = fVar141;
  auVar299._12_4_ = fVar141;
  auVar21 = vcvtdq2ps_avx(auVar24);
  auVar22 = vcvtdq2ps_avx(auVar124);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar69 = vfmadd213ps_fma(auVar22,auVar299,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar148);
  auVar22 = vcvtdq2ps_avx(auVar18);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar70 = vfmadd213ps_fma(auVar22,auVar299,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar184);
  auVar22 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar22,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar22 = vpmovsxwd_avx(auVar18);
  auVar18 = vfmadd213ps_fma(auVar187,auVar299,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar22 = vpmovsxwd_avx(auVar184);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar187 = vsubps_avx(auVar22,auVar21);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar22 = vpmovsxwd_avx(auVar23);
  auVar184 = vfmadd213ps_fma(auVar187,auVar299,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar58 * 0x21 + 6);
  auVar22 = vpmovsxwd_avx(auVar24);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar187 = vsubps_avx(auVar22,auVar21);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar58 * 0x1f + 6);
  auVar22 = vpmovsxwd_avx(auVar124);
  auVar187 = vfmadd213ps_fma(auVar187,auVar299,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar22);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar22 = vpmovsxwd_avx(auVar148);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar21);
  auVar22 = vfmadd213ps_fma(auVar22,auVar299,auVar21);
  auVar21 = vrcpps_avx(auVar19);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar19,auVar21,auVar98);
  auVar21 = vfmadd132ps_fma(auVar19,auVar21,auVar21);
  auVar19 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar19,auVar98);
  auVar20 = vfmadd132ps_fma(auVar20,auVar19,auVar19);
  auVar19 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar19,auVar98);
  auVar19 = vfmadd132ps_fma(auVar16,auVar19,auVar19);
  auVar16 = vsubps_avx(auVar69,auVar99);
  auVar180._0_4_ = auVar21._0_4_ * auVar16._0_4_;
  auVar180._4_4_ = auVar21._4_4_ * auVar16._4_4_;
  auVar180._8_4_ = auVar21._8_4_ * auVar16._8_4_;
  auVar180._12_4_ = auVar21._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar70,auVar99);
  auVar166._0_4_ = auVar21._0_4_ * auVar16._0_4_;
  auVar166._4_4_ = auVar21._4_4_ * auVar16._4_4_;
  auVar166._8_4_ = auVar21._8_4_ * auVar16._8_4_;
  auVar166._12_4_ = auVar21._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar18,auVar100);
  auVar201._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar201._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar201._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar201._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar184,auVar100);
  auVar99._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar99._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar99._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar99._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar187,auVar123);
  auVar146._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar146._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar146._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar146._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar22,auVar123);
  auVar69._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar69._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar69._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar69._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar180,auVar166);
  auVar19 = vpminsd_avx(auVar201,auVar99);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vpminsd_avx(auVar146,auVar69);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar245._4_4_ = uVar63;
  auVar245._0_4_ = uVar63;
  auVar245._8_4_ = uVar63;
  auVar245._12_4_ = uVar63;
  auVar19 = vmaxps_avx(auVar19,auVar245);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar224._0_4_ = auVar16._0_4_ * 0.99999964;
  auVar224._4_4_ = auVar16._4_4_ * 0.99999964;
  auVar224._8_4_ = auVar16._8_4_ * 0.99999964;
  auVar224._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar180,auVar166);
  auVar19 = vpmaxsd_avx(auVar201,auVar99);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar19 = vpmaxsd_avx(auVar146,auVar69);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar123._4_4_ = uVar63;
  auVar123._0_4_ = uVar63;
  auVar123._8_4_ = uVar63;
  auVar123._12_4_ = uVar63;
  auVar19 = vminps_avx(auVar19,auVar123);
  auVar16 = vminps_avx(auVar16,auVar19);
  auVar70._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar16._12_4_ * 1.0000004;
  p00.field_0.i[0]._1_3_ = 0;
  auVar100[4] = p00.field_0.i[0]._0_1_;
  auVar100._0_4_ = p00.field_0.i[0];
  auVar100._5_3_ = 0;
  auVar100[8] = p00.field_0.i[0]._0_1_;
  auVar100._9_3_ = 0;
  auVar100[0xc] = p00.field_0.i[0]._0_1_;
  auVar100._13_3_ = 0;
  auVar19 = vpcmpgtd_avx(auVar100,_DAT_01f4ad30);
  auVar16 = vcmpps_avx(auVar224,auVar70,2);
  auVar16 = vandps_avx(auVar16,auVar19);
  uVar63 = vmovmskps_avx(auVar16);
  uVar58 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar63);
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_450 = prim;
LAB_012959ed:
  if (uVar58 == 0) {
LAB_01297ad9:
    return uVar58 != 0;
  }
  lVar64 = 0;
  for (uVar61 = uVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar57 = *(uint *)(local_450 + 2);
  uVar8 = *(uint *)(local_450 + lVar64 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar57].ptr;
  fVar68 = (pGVar9->time_range).lower;
  fVar94 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar68) / ((pGVar9->time_range).upper - fVar68));
  auVar16 = vroundss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94),9);
  auVar16 = vminss_avx(auVar16,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar24 = vmaxss_avx(ZEXT816(0),auVar16);
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar24._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar65);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar65);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar61);
  lVar64 = uVar61 + 1;
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar64);
  lVar1 = uVar61 + 2;
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar61 + 3;
  pauVar3 = (undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar201 = *pauVar3;
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar65);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar65);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar61);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar64);
  auVar187 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar68 = *pfVar4;
  fVar141 = pfVar4[1];
  fVar96 = pfVar4[2];
  fVar144 = pfVar4[3];
  auVar308._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar308._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar308._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar308._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.0;
  auVar261._8_4_ = 0x3f000000;
  auVar261._0_8_ = 0x3f0000003f000000;
  auVar261._12_4_ = 0x3f000000;
  auVar18 = vfmadd231ps_fma(auVar308,auVar20,auVar261);
  auVar18 = vfmadd231ps_fma(auVar18,auVar19,ZEXT816(0) << 0x40);
  auVar166 = vfnmadd231ps_fma(auVar18,auVar16,auVar261);
  auVar202._8_4_ = 0x80000000;
  auVar202._0_8_ = 0x8000000080000000;
  auVar202._12_4_ = 0x80000000;
  auVar246._0_4_ = fVar68 * -0.0;
  auVar246._4_4_ = fVar141 * -0.0;
  auVar246._8_4_ = fVar96 * -0.0;
  auVar246._12_4_ = fVar144 * -0.0;
  auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar187,auVar246);
  auVar225._0_4_ = auVar22._0_4_ + auVar18._0_4_;
  auVar225._4_4_ = auVar22._4_4_ + auVar18._4_4_;
  auVar225._8_4_ = auVar22._8_4_ + auVar18._8_4_;
  auVar225._12_4_ = auVar22._12_4_ + auVar18._12_4_;
  auVar18 = vfmadd231ps_fma(auVar225,auVar21,auVar202);
  auVar124 = ZEXT816(0) << 0x20;
  auVar203._0_4_ = fVar68 * 0.0;
  auVar203._4_4_ = fVar141 * 0.0;
  auVar203._8_4_ = fVar96 * 0.0;
  auVar203._12_4_ = fVar144 * 0.0;
  auVar184 = vfmadd231ps_fma(auVar203,auVar187,auVar261);
  auVar184 = vfmadd231ps_fma(auVar184,auVar22,auVar124);
  auVar23 = vfnmadd231ps_fma(auVar184,auVar21,auVar261);
  auVar296._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar296._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar296._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar296._12_4_ = *(float *)(*pauVar3 + 0xc) * 0.5;
  auVar184 = vfmadd231ps_fma(auVar296,auVar124,auVar20);
  auVar184 = vfnmadd231ps_fma(auVar184,auVar261,auVar19);
  auVar69 = vfmadd231ps_fma(auVar184,auVar124,auVar16);
  auVar247._0_4_ = auVar246._0_4_ + auVar187._0_4_;
  auVar247._4_4_ = auVar246._4_4_ + auVar187._4_4_;
  auVar247._8_4_ = auVar246._8_4_ + auVar187._8_4_;
  auVar247._12_4_ = auVar246._12_4_ + auVar187._12_4_;
  auVar184 = vfmadd231ps_fma(auVar247,auVar22,auVar124);
  auVar184 = vfmadd231ps_fma(auVar184,auVar21,auVar202);
  auVar181._0_4_ = fVar68 * 0.5;
  auVar181._4_4_ = fVar141 * 0.5;
  auVar181._8_4_ = fVar96 * 0.5;
  auVar181._12_4_ = fVar144 * 0.5;
  auVar187 = vfmadd231ps_fma(auVar181,auVar124,auVar187);
  auVar22 = vfnmadd231ps_fma(auVar187,auVar261,auVar22);
  auVar187 = vfmadd231ps_fma(auVar22,auVar124,auVar21);
  auVar21 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar22 = vshufps_avx(auVar18,auVar18,0xc9);
  fVar241 = auVar166._0_4_;
  auVar101._0_4_ = fVar241 * auVar22._0_4_;
  fVar242 = auVar166._4_4_;
  auVar101._4_4_ = fVar242 * auVar22._4_4_;
  fVar243 = auVar166._8_4_;
  auVar101._8_4_ = fVar243 * auVar22._8_4_;
  fVar95 = auVar166._12_4_;
  auVar101._12_4_ = fVar95 * auVar22._12_4_;
  auVar70 = vfmsub231ps_fma(auVar101,auVar21,auVar18);
  auVar22 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar102._0_4_ = fVar241 * auVar22._0_4_;
  auVar102._4_4_ = fVar242 * auVar22._4_4_;
  auVar102._8_4_ = fVar243 * auVar22._8_4_;
  auVar102._12_4_ = fVar95 * auVar22._12_4_;
  auVar99 = vfmsub231ps_fma(auVar102,auVar21,auVar23);
  auVar21 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar22 = vshufps_avx(auVar184,auVar184,0xc9);
  fVar237 = auVar69._0_4_;
  auVar103._0_4_ = fVar237 * auVar22._0_4_;
  fVar238 = auVar69._4_4_;
  auVar103._4_4_ = fVar238 * auVar22._4_4_;
  fVar239 = auVar69._8_4_;
  auVar103._8_4_ = fVar239 * auVar22._8_4_;
  fVar240 = auVar69._12_4_;
  auVar103._12_4_ = fVar240 * auVar22._12_4_;
  auVar100 = vfmsub231ps_fma(auVar103,auVar21,auVar184);
  auVar22 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar104._0_4_ = fVar237 * auVar22._0_4_;
  auVar104._4_4_ = fVar238 * auVar22._4_4_;
  auVar104._8_4_ = fVar239 * auVar22._8_4_;
  auVar104._12_4_ = fVar240 * auVar22._12_4_;
  auVar123 = vfmsub231ps_fma(auVar104,auVar21,auVar187);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar65);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar65);
  auVar21 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar64);
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * lVar2);
  auVar55 = *pauVar5;
  fVar143 = *(float *)pauVar5[1];
  lVar14 = *(long *)(lVar11 + 0x38 + lVar65);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar65);
  auVar288._0_4_ = *(float *)*pauVar5 * 0.0;
  auVar288._4_4_ = *(float *)(*pauVar5 + 4) * 0.0;
  auVar288._8_4_ = *(float *)(*pauVar5 + 8) * 0.0;
  auVar288._12_4_ = fVar143 * 0.0;
  auVar187 = vfmadd231ps_fma(auVar288,auVar22,auVar261);
  auVar18 = vfmadd231ps_fma(auVar187,auVar21,ZEXT816(0) << 0x20);
  auVar187 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar61);
  auVar180 = vfnmadd231ps_fma(auVar18,auVar187,auVar261);
  auVar18 = *(undefined1 (*) [16])(lVar14 + lVar1 * lVar11);
  pfVar4 = (float *)(lVar14 + lVar11 * lVar2);
  fVar68 = *pfVar4;
  fVar141 = pfVar4[1];
  fVar96 = pfVar4[2];
  fVar144 = pfVar4[3];
  auVar147._0_4_ = fVar68 * -0.0;
  auVar147._4_4_ = fVar141 * -0.0;
  auVar147._8_4_ = fVar96 * -0.0;
  auVar147._12_4_ = fVar144 * -0.0;
  auVar23 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar18,auVar147);
  auVar184 = *(undefined1 (*) [16])(lVar14 + lVar64 * lVar11);
  auVar182._0_4_ = auVar184._0_4_ + auVar23._0_4_;
  auVar182._4_4_ = auVar184._4_4_ + auVar23._4_4_;
  auVar182._8_4_ = auVar184._8_4_ + auVar23._8_4_;
  auVar182._12_4_ = auVar184._12_4_ + auVar23._12_4_;
  auVar23 = *(undefined1 (*) [16])(lVar14 + uVar61 * lVar11);
  auVar148 = vfmadd231ps_fma(auVar182,auVar23,auVar202);
  auVar124 = vshufps_avx(auVar148,auVar148,0xc9);
  fVar200 = auVar180._0_4_;
  auVar71._0_4_ = fVar200 * auVar124._0_4_;
  fVar223 = auVar180._4_4_;
  auVar71._4_4_ = fVar223 * auVar124._4_4_;
  fVar221 = auVar180._8_4_;
  auVar71._8_4_ = fVar221 * auVar124._8_4_;
  fVar222 = auVar180._12_4_;
  auVar71._12_4_ = fVar222 * auVar124._12_4_;
  auVar124 = vshufps_avx(auVar180,auVar180,0xc9);
  auVar98 = vfmsub231ps_fma(auVar71,auVar124,auVar148);
  auVar72._0_4_ = fVar68 * 0.0;
  auVar72._4_4_ = fVar141 * 0.0;
  auVar72._8_4_ = fVar96 * 0.0;
  auVar72._12_4_ = fVar144 * 0.0;
  auVar167._8_4_ = 0x3f000000;
  auVar167._0_8_ = 0x3f0000003f000000;
  auVar167._12_4_ = 0x3f000000;
  auVar148 = vfmadd231ps_fma(auVar72,auVar18,auVar167);
  auVar148 = vfmadd231ps_fma(auVar148,auVar184,ZEXT816(0) << 0x20);
  auVar145 = vfnmadd231ps_fma(auVar148,auVar23,auVar167);
  auVar148 = vshufps_avx(auVar145,auVar145,0xc9);
  auVar183._0_4_ = fVar200 * auVar148._0_4_;
  auVar183._4_4_ = fVar223 * auVar148._4_4_;
  auVar183._8_4_ = fVar221 * auVar148._8_4_;
  auVar183._12_4_ = fVar222 * auVar148._12_4_;
  auVar145 = vfmsub231ps_fma(auVar183,auVar124,auVar145);
  auVar73._0_4_ = auVar18._0_4_ + auVar147._0_4_;
  auVar73._4_4_ = auVar18._4_4_ + auVar147._4_4_;
  auVar73._8_4_ = auVar18._8_4_ + auVar147._8_4_;
  auVar73._12_4_ = auVar18._12_4_ + auVar147._12_4_;
  auVar105._0_4_ = fVar68 * 0.5;
  auVar105._4_4_ = fVar141 * 0.5;
  auVar105._8_4_ = fVar96 * 0.5;
  auVar105._12_4_ = fVar144 * 0.5;
  auVar148 = ZEXT416(0) << 0x20;
  auVar18 = vfmadd231ps_fma(auVar105,auVar148,auVar18);
  auVar124 = vfmadd231ps_fma(auVar73,auVar184,auVar148);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar167,auVar184);
  auVar184 = vfmadd231ps_fma(auVar124,auVar23,auVar202);
  auVar23 = vfmadd231ps_fma(auVar18,auVar148,auVar23);
  auVar329._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar329._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar329._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar329._12_4_ = fVar143 * 0.5;
  auVar18 = vfmadd231ps_fma(auVar329,auVar148,auVar22);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar167,auVar21);
  auVar124 = vfmadd231ps_fma(auVar18,auVar148,auVar187);
  auVar332._12_4_ = 0;
  auVar332._0_12_ = ZEXT812(0);
  auVar18 = vshufps_avx(auVar184,auVar184,0xc9);
  fVar327 = auVar124._0_4_;
  auVar149._0_4_ = fVar327 * auVar18._0_4_;
  fVar337 = auVar124._4_4_;
  auVar149._4_4_ = fVar337 * auVar18._4_4_;
  fVar338 = auVar124._8_4_;
  auVar149._8_4_ = fVar338 * auVar18._8_4_;
  fVar339 = auVar124._12_4_;
  auVar149._12_4_ = fVar339 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar146 = vfmsub231ps_fma(auVar149,auVar18,auVar184);
  auVar184 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar74._0_4_ = fVar327 * auVar184._0_4_;
  auVar74._4_4_ = fVar337 * auVar184._4_4_;
  auVar74._8_4_ = fVar338 * auVar184._8_4_;
  auVar74._12_4_ = fVar339 * auVar184._12_4_;
  auVar165 = vfmsub231ps_fma(auVar74,auVar18,auVar23);
  fVar94 = fVar94 - auVar24._0_4_;
  local_558._0_4_ = auVar201._0_4_;
  local_558._4_4_ = auVar201._4_4_;
  uStack_550._0_4_ = auVar201._8_4_;
  uStack_550._4_4_ = auVar201._12_4_;
  auVar75._0_4_ = (float)local_558._0_4_ * -0.0;
  auVar75._4_4_ = (float)local_558._4_4_ * -0.0;
  auVar75._8_4_ = (float)uStack_550 * -0.0;
  auVar75._12_4_ = uStack_550._4_4_ * -0.0;
  auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar20,auVar75);
  auVar168._0_4_ = auVar20._0_4_ + auVar75._0_4_;
  auVar168._4_4_ = auVar20._4_4_ + auVar75._4_4_;
  auVar168._8_4_ = auVar20._8_4_ + auVar75._8_4_;
  auVar168._12_4_ = auVar20._12_4_ + auVar75._12_4_;
  auVar248._0_4_ = auVar19._0_4_ + auVar18._0_4_;
  auVar248._4_4_ = auVar19._4_4_ + auVar18._4_4_;
  auVar248._8_4_ = auVar19._8_4_ + auVar18._8_4_;
  auVar248._12_4_ = auVar19._12_4_ + auVar18._12_4_;
  auVar18 = vfmadd231ps_fma(auVar168,auVar19,auVar332 << 0x20);
  auVar20 = vpermilps_avx(auVar70,0xc9);
  auVar19 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar23 = vfmadd231ps_fma(auVar248,auVar16,auVar202);
  auVar24 = vfmadd231ps_fma(auVar18,auVar16,auVar202);
  auVar18 = vpermilps_avx(auVar99,0xc9);
  fVar141 = auVar19._0_4_;
  auVar184 = ZEXT416((uint)fVar141);
  auVar16 = vrsqrtss_avx(auVar184,auVar184);
  fVar68 = auVar16._0_4_;
  auVar16 = vdpps_avx(auVar20,auVar18,0x7f);
  fVar68 = fVar68 * 1.5 + fVar141 * -0.5 * fVar68 * fVar68 * fVar68;
  auVar106._0_4_ = fVar141 * auVar18._0_4_;
  auVar106._4_4_ = fVar141 * auVar18._4_4_;
  auVar106._8_4_ = fVar141 * auVar18._8_4_;
  auVar106._12_4_ = fVar141 * auVar18._12_4_;
  fVar141 = auVar16._0_4_;
  auVar204._0_4_ = fVar141 * auVar20._0_4_;
  auVar204._4_4_ = fVar141 * auVar20._4_4_;
  auVar204._8_4_ = fVar141 * auVar20._8_4_;
  auVar204._12_4_ = fVar141 * auVar20._12_4_;
  auVar18 = vsubps_avx(auVar106,auVar204);
  auVar16 = vrcpss_avx(auVar184,auVar184);
  auVar19 = vfnmadd213ss_fma(auVar19,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar16._0_4_ * auVar19._0_4_;
  auVar184 = vpermilps_avx(auVar100,0xc9);
  fVar122 = auVar20._0_4_ * fVar68;
  fVar138 = auVar20._4_4_ * fVar68;
  fVar139 = auVar20._8_4_ * fVar68;
  fVar140 = auVar20._12_4_ * fVar68;
  auVar19 = vdpps_avx(auVar184,auVar184,0x7f);
  auVar16 = vblendps_avx(auVar19,_DAT_01f45a50,0xe);
  auVar20 = vrsqrtss_avx(auVar16,auVar16);
  fVar144 = auVar19._0_4_;
  fVar141 = auVar20._0_4_;
  fVar141 = fVar141 * 1.5 + fVar141 * fVar141 * fVar144 * -0.5 * fVar141;
  auVar20 = vpermilps_avx(auVar123,0xc9);
  auVar262._0_4_ = fVar144 * auVar20._0_4_;
  auVar262._4_4_ = fVar144 * auVar20._4_4_;
  auVar262._8_4_ = fVar144 * auVar20._8_4_;
  auVar262._12_4_ = fVar144 * auVar20._12_4_;
  auVar20 = vdpps_avx(auVar184,auVar20,0x7f);
  fVar144 = auVar20._0_4_;
  auVar226._0_4_ = fVar144 * auVar184._0_4_;
  auVar226._4_4_ = fVar144 * auVar184._4_4_;
  auVar226._8_4_ = fVar144 * auVar184._8_4_;
  auVar226._12_4_ = fVar144 * auVar184._12_4_;
  auVar20 = vsubps_avx(auVar262,auVar226);
  auVar16 = vrcpss_avx(auVar16,auVar16);
  auVar19 = vfnmadd213ss_fma(auVar19,auVar16,ZEXT416(0x40000000));
  fVar144 = auVar16._0_4_ * auVar19._0_4_;
  fVar142 = auVar184._0_4_ * fVar141;
  fVar162 = auVar184._4_4_ * fVar141;
  fVar163 = auVar184._8_4_ * fVar141;
  fVar164 = auVar184._12_4_ * fVar141;
  auVar16 = vshufps_avx(auVar166,auVar166,0xff);
  auVar19 = vshufps_avx(auVar23,auVar23,0xff);
  auVar227._0_4_ = auVar19._0_4_ * fVar122;
  auVar227._4_4_ = auVar19._4_4_ * fVar138;
  auVar227._8_4_ = auVar19._8_4_ * fVar139;
  auVar227._12_4_ = auVar19._12_4_ * fVar140;
  auVar76._0_4_ = auVar16._0_4_ * fVar122 + auVar19._0_4_ * fVar68 * fVar96 * auVar18._0_4_;
  auVar76._4_4_ = auVar16._4_4_ * fVar138 + auVar19._4_4_ * fVar68 * fVar96 * auVar18._4_4_;
  auVar76._8_4_ = auVar16._8_4_ * fVar139 + auVar19._8_4_ * fVar68 * fVar96 * auVar18._8_4_;
  auVar76._12_4_ = auVar16._12_4_ * fVar140 + auVar19._12_4_ * fVar68 * fVar96 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar23,auVar227);
  p00.field_0.v[0] = auVar23._0_4_ + auVar227._0_4_;
  p00.field_0.v[1] = auVar23._4_4_ + auVar227._4_4_;
  p00.field_0.v[2] = auVar23._8_4_ + auVar227._8_4_;
  p00.field_0.v[3] = auVar23._12_4_ + auVar227._12_4_;
  auVar184 = vsubps_avx(auVar166,auVar76);
  auVar16 = vshufps_avx(auVar69,auVar69,0xff);
  auVar19 = vshufps_avx(auVar24,auVar24,0xff);
  auVar150._0_4_ = auVar19._0_4_ * fVar142;
  auVar150._4_4_ = auVar19._4_4_ * fVar162;
  auVar150._8_4_ = auVar19._8_4_ * fVar163;
  auVar150._12_4_ = auVar19._12_4_ * fVar164;
  auVar185._0_4_ = auVar16._0_4_ * fVar142 + auVar19._0_4_ * fVar141 * auVar20._0_4_ * fVar144;
  auVar185._4_4_ = auVar16._4_4_ * fVar162 + auVar19._4_4_ * fVar141 * auVar20._4_4_ * fVar144;
  auVar185._8_4_ = auVar16._8_4_ * fVar163 + auVar19._8_4_ * fVar141 * auVar20._8_4_ * fVar144;
  auVar185._12_4_ = auVar16._12_4_ * fVar164 + auVar19._12_4_ * fVar141 * auVar20._12_4_ * fVar144;
  auVar20 = vsubps_avx(auVar24,auVar150);
  p02.field_0.v[1] = auVar24._4_4_ + auVar150._4_4_;
  p02.field_0.v[0] = auVar24._0_4_ + auVar150._0_4_;
  p02.field_0.v[2] = auVar24._8_4_ + auVar150._8_4_;
  p02.field_0.v[3] = auVar24._12_4_ + auVar150._12_4_;
  auVar23 = vsubps_avx(auVar69,auVar185);
  auVar186._8_4_ = 0x80000000;
  auVar186._0_8_ = 0x8000000080000000;
  auVar186._12_4_ = 0x80000000;
  local_5d8 = auVar55._0_4_;
  fStack_5d4 = auVar55._4_4_;
  fStack_5d0 = auVar55._8_4_;
  auVar151._0_4_ = local_5d8 * -0.0;
  auVar151._4_4_ = fStack_5d4 * -0.0;
  auVar151._8_4_ = fStack_5d0 * -0.0;
  auVar151._12_4_ = fVar143 * -0.0;
  auVar16 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar22,auVar151);
  auVar228._0_4_ = auVar22._0_4_ + auVar151._0_4_;
  auVar228._4_4_ = auVar22._4_4_ + auVar151._4_4_;
  auVar228._8_4_ = auVar22._8_4_ + auVar151._8_4_;
  auVar228._12_4_ = auVar22._12_4_ + auVar151._12_4_;
  auVar319._0_4_ = auVar21._0_4_ + auVar16._0_4_;
  auVar319._4_4_ = auVar21._4_4_ + auVar16._4_4_;
  auVar319._8_4_ = auVar21._8_4_ + auVar16._8_4_;
  auVar319._12_4_ = auVar21._12_4_ + auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar228,auVar21,ZEXT416(0) << 0x20);
  auVar24 = vfmadd231ps_fma(auVar319,auVar187,auVar186);
  auVar148 = vfmadd231ps_fma(auVar16,auVar187,auVar186);
  auVar22 = vpermilps_avx(auVar98,0xc9);
  auVar16 = vdpps_avx(auVar22,auVar22,0x7f);
  fVar141 = auVar16._0_4_;
  auVar187 = ZEXT416((uint)fVar141);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar19 = vrsqrtss_avx(auVar187,auVar187);
  fVar68 = auVar19._0_4_;
  auVar21 = vpermilps_avx(auVar145,0xc9);
  auVar19 = vdpps_avx(auVar22,auVar21,0x7f);
  fVar68 = fVar141 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
  auVar249._0_4_ = fVar141 * auVar21._0_4_;
  auVar249._4_4_ = fVar141 * auVar21._4_4_;
  auVar249._8_4_ = fVar141 * auVar21._8_4_;
  auVar249._12_4_ = fVar141 * auVar21._12_4_;
  fVar141 = auVar19._0_4_;
  auVar263._0_4_ = fVar141 * auVar22._0_4_;
  auVar263._4_4_ = fVar141 * auVar22._4_4_;
  auVar263._8_4_ = fVar141 * auVar22._8_4_;
  auVar263._12_4_ = fVar141 * auVar22._12_4_;
  auVar21 = vsubps_avx(auVar249,auVar263);
  auVar19 = vrcpss_avx(auVar187,auVar187);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar19._0_4_ * auVar16._0_4_;
  auVar187 = vpermilps_avx(auVar146,0xc9);
  auVar16 = vdpps_avx(auVar187,auVar187,0x7f);
  fVar143 = auVar22._0_4_ * fVar68;
  fVar122 = auVar22._4_4_ * fVar68;
  fVar138 = auVar22._8_4_ * fVar68;
  fVar139 = auVar22._12_4_ * fVar68;
  fVar144 = auVar16._0_4_;
  auVar205._4_12_ = SUB1612(auVar154 << 0x40,4);
  auVar205._0_4_ = fVar144;
  auVar19 = vrsqrtss_avx(auVar205,auVar205);
  fVar141 = auVar19._0_4_;
  fVar141 = fVar141 * 1.5 + fVar144 * -0.5 * fVar141 * fVar141 * fVar141;
  auVar22 = vpermilps_avx(auVar165,0xc9);
  auVar19 = vdpps_avx(auVar187,auVar22,0x7f);
  auVar277._0_4_ = fVar144 * auVar22._0_4_;
  auVar277._4_4_ = fVar144 * auVar22._4_4_;
  auVar277._8_4_ = fVar144 * auVar22._8_4_;
  auVar277._12_4_ = fVar144 * auVar22._12_4_;
  fVar144 = auVar19._0_4_;
  auVar297._0_4_ = fVar144 * auVar187._0_4_;
  auVar297._4_4_ = fVar144 * auVar187._4_4_;
  auVar297._8_4_ = fVar144 * auVar187._8_4_;
  auVar297._12_4_ = fVar144 * auVar187._12_4_;
  auVar22 = vsubps_avx(auVar277,auVar297);
  auVar19 = vrcpss_avx(auVar205,auVar205);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar144 = auVar16._0_4_ * auVar19._0_4_;
  fVar140 = fVar141 * auVar187._0_4_;
  fVar142 = fVar141 * auVar187._4_4_;
  fVar162 = fVar141 * auVar187._8_4_;
  fVar163 = fVar141 * auVar187._12_4_;
  auVar16 = vshufps_avx(auVar180,auVar180,0xff);
  auVar19 = vshufps_avx(auVar24,auVar24,0xff);
  auVar152._0_4_ = auVar19._0_4_ * fVar143;
  auVar152._4_4_ = auVar19._4_4_ * fVar122;
  auVar152._8_4_ = auVar19._8_4_ * fVar138;
  auVar152._12_4_ = auVar19._12_4_ * fVar139;
  auVar169._0_4_ = auVar16._0_4_ * fVar143 + auVar19._0_4_ * fVar68 * auVar21._0_4_ * fVar96;
  auVar169._4_4_ = auVar16._4_4_ * fVar122 + auVar19._4_4_ * fVar68 * auVar21._4_4_ * fVar96;
  auVar169._8_4_ = auVar16._8_4_ * fVar138 + auVar19._8_4_ * fVar68 * auVar21._8_4_ * fVar96;
  auVar169._12_4_ = auVar16._12_4_ * fVar139 + auVar19._12_4_ * fVar68 * auVar21._12_4_ * fVar96;
  auVar21 = vsubps_avx(auVar24,auVar152);
  fVar96 = auVar24._0_4_ + auVar152._0_4_;
  fVar143 = auVar24._4_4_ + auVar152._4_4_;
  fVar122 = auVar24._8_4_ + auVar152._8_4_;
  fVar138 = auVar24._12_4_ + auVar152._12_4_;
  auVar187 = vsubps_avx(auVar180,auVar169);
  auVar16 = vshufps_avx(auVar124,auVar124,0xff);
  auVar19 = vshufps_avx(auVar148,auVar148,0xff);
  auVar264._0_4_ = auVar19._0_4_ * fVar140;
  auVar264._4_4_ = auVar19._4_4_ * fVar142;
  auVar264._8_4_ = auVar19._8_4_ * fVar162;
  auVar264._12_4_ = auVar19._12_4_ * fVar163;
  auVar206._0_4_ = fVar140 * auVar16._0_4_ + auVar19._0_4_ * fVar141 * auVar22._0_4_ * fVar144;
  auVar206._4_4_ = fVar142 * auVar16._4_4_ + auVar19._4_4_ * fVar141 * auVar22._4_4_ * fVar144;
  auVar206._8_4_ = fVar162 * auVar16._8_4_ + auVar19._8_4_ * fVar141 * auVar22._8_4_ * fVar144;
  auVar206._12_4_ = fVar163 * auVar16._12_4_ + auVar19._12_4_ * fVar141 * auVar22._12_4_ * fVar144;
  auVar16 = vsubps_avx(auVar148,auVar264);
  auVar170._0_4_ = auVar264._0_4_ + auVar148._0_4_;
  auVar170._4_4_ = auVar264._4_4_ + auVar148._4_4_;
  auVar170._8_4_ = auVar264._8_4_ + auVar148._8_4_;
  auVar170._12_4_ = auVar264._12_4_ + auVar148._12_4_;
  auVar19 = vsubps_avx(auVar124,auVar206);
  local_528 = auVar184._0_4_;
  fStack_524 = auVar184._4_4_;
  fStack_520 = auVar184._8_4_;
  fStack_51c = auVar184._12_4_;
  auVar309._0_4_ = auVar18._0_4_ + local_528 * 0.33333334;
  auVar309._4_4_ = auVar18._4_4_ + fStack_524 * 0.33333334;
  auVar309._8_4_ = auVar18._8_4_ + fStack_520 * 0.33333334;
  auVar309._12_4_ = auVar18._12_4_ + fStack_51c * 0.33333334;
  fVar68 = 1.0 - fVar94;
  auVar207._4_4_ = fVar68;
  auVar207._0_4_ = fVar68;
  auVar207._8_4_ = fVar68;
  auVar207._12_4_ = fVar68;
  auVar278._0_4_ = fVar94 * auVar21._0_4_;
  auVar278._4_4_ = fVar94 * auVar21._4_4_;
  auVar278._8_4_ = fVar94 * auVar21._8_4_;
  auVar278._12_4_ = fVar94 * auVar21._12_4_;
  local_418 = vfmadd231ps_fma(auVar278,auVar207,auVar18);
  auVar125._0_4_ = fVar94 * (auVar21._0_4_ + auVar187._0_4_ * 0.33333334);
  auVar125._4_4_ = fVar94 * (auVar21._4_4_ + auVar187._4_4_ * 0.33333334);
  auVar125._8_4_ = fVar94 * (auVar21._8_4_ + auVar187._8_4_ * 0.33333334);
  auVar125._12_4_ = fVar94 * (auVar21._12_4_ + auVar187._12_4_ * 0.33333334);
  auVar145 = vfmadd231ps_fma(auVar125,auVar207,auVar309);
  local_508._0_4_ = auVar23._0_4_;
  local_508._4_4_ = auVar23._4_4_;
  uStack_500._0_4_ = auVar23._8_4_;
  uStack_500._4_4_ = auVar23._12_4_;
  auVar126._0_4_ = (float)local_508._0_4_ * 0.33333334;
  auVar126._4_4_ = (float)local_508._4_4_ * 0.33333334;
  auVar126._8_4_ = (float)uStack_500 * 0.33333334;
  auVar126._12_4_ = uStack_500._4_4_ * 0.33333334;
  auVar21 = vsubps_avx(auVar20,auVar126);
  auVar310._0_4_ = (fVar241 + auVar76._0_4_) * 0.33333334 + p00.field_0.v[0];
  auVar310._4_4_ = (fVar242 + auVar76._4_4_) * 0.33333334 + p00.field_0.v[1];
  auVar310._8_4_ = (fVar243 + auVar76._8_4_) * 0.33333334 + p00.field_0.v[2];
  auVar310._12_4_ = (fVar95 + auVar76._12_4_) * 0.33333334 + p00.field_0.v[3];
  auVar298._0_4_ = (fVar237 + auVar185._0_4_) * 0.33333334;
  auVar298._4_4_ = (fVar238 + auVar185._4_4_) * 0.33333334;
  auVar298._8_4_ = (fVar239 + auVar185._8_4_) * 0.33333334;
  auVar298._12_4_ = (fVar240 + auVar185._12_4_) * 0.33333334;
  auVar22 = vsubps_avx((undefined1  [16])p02.field_0,auVar298);
  auVar289._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar289._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar289._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar289._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar16,auVar289);
  auVar229._0_4_ = (fVar327 + auVar206._0_4_) * 0.33333334;
  auVar229._4_4_ = (fVar337 + auVar206._4_4_) * 0.33333334;
  auVar229._8_4_ = (fVar338 + auVar206._8_4_) * 0.33333334;
  auVar229._12_4_ = (fVar339 + auVar206._12_4_) * 0.33333334;
  auVar187 = vsubps_avx(auVar170,auVar229);
  auVar290._0_4_ = fVar94 * auVar19._0_4_;
  auVar290._4_4_ = fVar94 * auVar19._4_4_;
  auVar290._8_4_ = fVar94 * auVar19._8_4_;
  auVar290._12_4_ = fVar94 * auVar19._12_4_;
  auVar250._0_4_ = fVar94 * auVar16._0_4_;
  auVar250._4_4_ = fVar94 * auVar16._4_4_;
  auVar250._8_4_ = fVar94 * auVar16._8_4_;
  auVar250._12_4_ = fVar94 * auVar16._12_4_;
  local_428 = vfmadd231ps_fma(auVar290,auVar207,auVar21);
  auVar146 = vfmadd231ps_fma(auVar250,auVar207,auVar20);
  auVar107._0_4_ = fVar94 * fVar96;
  auVar107._4_4_ = fVar94 * fVar143;
  auVar107._8_4_ = fVar94 * fVar122;
  auVar107._12_4_ = fVar94 * fVar138;
  auVar127._0_4_ = fVar94 * (fVar96 + (fVar200 + auVar169._0_4_) * 0.33333334);
  auVar127._4_4_ = fVar94 * (fVar143 + (fVar223 + auVar169._4_4_) * 0.33333334);
  auVar127._8_4_ = fVar94 * (fVar122 + (fVar221 + auVar169._8_4_) * 0.33333334);
  auVar127._12_4_ = fVar94 * (fVar138 + (fVar222 + auVar169._12_4_) * 0.33333334);
  auVar188._0_4_ = fVar94 * auVar187._0_4_;
  auVar188._4_4_ = fVar94 * auVar187._4_4_;
  auVar188._8_4_ = fVar94 * auVar187._8_4_;
  auVar188._12_4_ = fVar94 * auVar187._12_4_;
  auVar171._0_4_ = fVar94 * auVar170._0_4_;
  auVar171._4_4_ = fVar94 * auVar170._4_4_;
  auVar171._8_4_ = fVar94 * auVar170._8_4_;
  auVar171._12_4_ = fVar94 * auVar170._12_4_;
  _local_438 = vfmadd231ps_fma(auVar107,auVar207,(undefined1  [16])p00.field_0);
  _local_448 = vfmadd231ps_fma(auVar127,auVar207,auVar310);
  auVar165 = vfmadd231ps_fma(auVar188,auVar207,auVar22);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar166 = vfmadd231ps_fma(auVar171,auVar207,(undefined1  [16])p02.field_0);
  local_3f8 = vsubps_avx(local_418,auVar16);
  auVar19 = vshufps_avx(local_3f8,local_3f8,0x55);
  auVar20 = vshufps_avx(local_3f8,local_3f8,0xaa);
  aVar7 = pre->ray_space[k].vy.field_0;
  fVar68 = pre->ray_space[k].vz.field_0.m128[0];
  fVar141 = pre->ray_space[k].vz.field_0.m128[1];
  fVar94 = pre->ray_space[k].vz.field_0.m128[2];
  fVar96 = pre->ray_space[k].vz.field_0.m128[3];
  auVar77._0_4_ = fVar68 * auVar20._0_4_;
  auVar77._4_4_ = fVar141 * auVar20._4_4_;
  auVar77._8_4_ = fVar94 * auVar20._8_4_;
  auVar77._12_4_ = fVar96 * auVar20._12_4_;
  auVar21 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar7,auVar19);
  local_408 = vsubps_avx(auVar145,auVar16);
  auVar19 = vshufps_avx(local_408,local_408,0x55);
  auVar20 = vshufps_avx(local_408,local_408,0xaa);
  auVar330._0_4_ = fVar68 * auVar20._0_4_;
  auVar330._4_4_ = fVar141 * auVar20._4_4_;
  auVar330._8_4_ = fVar94 * auVar20._8_4_;
  auVar330._12_4_ = fVar96 * auVar20._12_4_;
  auVar20 = vfmadd231ps_fma(auVar330,(undefined1  [16])aVar7,auVar19);
  auVar184 = vsubps_avx(local_428,auVar16);
  auVar19 = vshufps_avx(auVar184,auVar184,0xaa);
  auVar311._0_4_ = fVar68 * auVar19._0_4_;
  auVar311._4_4_ = fVar141 * auVar19._4_4_;
  auVar311._8_4_ = fVar94 * auVar19._8_4_;
  auVar311._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar184,auVar184,0x55);
  auVar22 = vfmadd231ps_fma(auVar311,(undefined1  [16])aVar7,auVar19);
  auVar23 = vsubps_avx(auVar146,auVar16);
  auVar19 = vshufps_avx(auVar23,auVar23,0xaa);
  auVar320._0_4_ = fVar68 * auVar19._0_4_;
  auVar320._4_4_ = fVar141 * auVar19._4_4_;
  auVar320._8_4_ = fVar94 * auVar19._8_4_;
  auVar320._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar23,auVar23,0x55);
  auVar187 = vfmadd231ps_fma(auVar320,(undefined1  [16])aVar7,auVar19);
  auVar24 = vsubps_avx(_local_438,auVar16);
  auVar19 = vshufps_avx(auVar24,auVar24,0xaa);
  auVar172._0_4_ = fVar68 * auVar19._0_4_;
  auVar172._4_4_ = fVar141 * auVar19._4_4_;
  auVar172._8_4_ = fVar94 * auVar19._8_4_;
  auVar172._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar24,auVar24,0x55);
  auVar18 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar7,auVar19);
  auVar124 = vsubps_avx(_local_448,auVar16);
  auVar19 = vshufps_avx(auVar124,auVar124,0xaa);
  auVar230._0_4_ = fVar68 * auVar19._0_4_;
  auVar230._4_4_ = fVar141 * auVar19._4_4_;
  auVar230._8_4_ = fVar94 * auVar19._8_4_;
  auVar230._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar124,auVar124,0x55);
  auVar70 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar7,auVar19);
  auVar148 = vsubps_avx(auVar165,auVar16);
  auVar19 = vshufps_avx(auVar148,auVar148,0xaa);
  auVar265._0_4_ = fVar68 * auVar19._0_4_;
  auVar265._4_4_ = fVar141 * auVar19._4_4_;
  auVar265._8_4_ = fVar94 * auVar19._8_4_;
  auVar265._12_4_ = fVar96 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar148,auVar148,0x55);
  auVar19 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar7,auVar19);
  auVar69 = vsubps_avx(auVar166,auVar16);
  auVar16 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar189._0_4_ = fVar68 * auVar16._0_4_;
  auVar189._4_4_ = fVar141 * auVar16._4_4_;
  auVar189._8_4_ = fVar94 * auVar16._8_4_;
  auVar189._12_4_ = fVar96 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar69,auVar69,0x55);
  auVar16 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar7,auVar16);
  auVar208._4_4_ = local_3f8._0_4_;
  auVar208._0_4_ = local_3f8._0_4_;
  auVar208._8_4_ = local_3f8._0_4_;
  auVar208._12_4_ = local_3f8._0_4_;
  aVar7 = pre->ray_space[k].vx.field_0;
  auVar99 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar7,auVar208);
  auVar209._4_4_ = local_408._0_4_;
  auVar209._0_4_ = local_408._0_4_;
  auVar209._8_4_ = local_408._0_4_;
  auVar209._12_4_ = local_408._0_4_;
  auVar100 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar209);
  uVar63 = auVar184._0_4_;
  auVar210._4_4_ = uVar63;
  auVar210._0_4_ = uVar63;
  auVar210._8_4_ = uVar63;
  auVar210._12_4_ = uVar63;
  auVar123 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar7,auVar210);
  uVar63 = auVar23._0_4_;
  auVar211._4_4_ = uVar63;
  auVar211._0_4_ = uVar63;
  auVar211._8_4_ = uVar63;
  auVar211._12_4_ = uVar63;
  auVar98 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar7,auVar211);
  uVar63 = auVar24._0_4_;
  auVar212._4_4_ = uVar63;
  auVar212._0_4_ = uVar63;
  auVar212._8_4_ = uVar63;
  auVar212._12_4_ = uVar63;
  auVar180 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar7,auVar212);
  uVar63 = auVar124._0_4_;
  auVar213._4_4_ = uVar63;
  auVar213._0_4_ = uVar63;
  auVar213._8_4_ = uVar63;
  auVar213._12_4_ = uVar63;
  auVar201 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar7,auVar213);
  uVar63 = auVar148._0_4_;
  auVar214._4_4_ = uVar63;
  auVar214._0_4_ = uVar63;
  auVar214._8_4_ = uVar63;
  auVar214._12_4_ = uVar63;
  auVar244 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar214);
  uVar63 = auVar69._0_4_;
  auVar215._4_4_ = uVar63;
  auVar215._0_4_ = uVar63;
  auVar215._8_4_ = uVar63;
  auVar215._12_4_ = uVar63;
  auVar245 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar7,auVar215);
  auVar21 = vmovlhps_avx(auVar99,auVar180);
  auVar22 = vmovlhps_avx(auVar100,auVar201);
  auVar187 = vmovlhps_avx(auVar123,auVar244);
  auVar18 = vmovlhps_avx(auVar98,auVar245);
  auVar16 = vminps_avx(auVar21,auVar22);
  auVar19 = vminps_avx(auVar187,auVar18);
  auVar20 = vminps_avx(auVar16,auVar19);
  auVar16 = vmaxps_avx(auVar21,auVar22);
  auVar19 = vmaxps_avx(auVar187,auVar18);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vshufpd_avx(auVar20,auVar20,3);
  auVar20 = vminps_avx(auVar20,auVar19);
  auVar19 = vshufpd_avx(auVar16,auVar16,3);
  auVar19 = vmaxps_avx(auVar16,auVar19);
  auVar16 = vandps_avx(local_3e8,auVar20);
  auVar19 = vandps_avx(auVar19,local_3e8);
  auVar16 = vmaxps_avx(auVar16,auVar19);
  auVar19 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar19,auVar16);
  fVar141 = auVar16._0_4_ * 9.536743e-07;
  auVar251._8_8_ = auVar99._0_8_;
  auVar251._0_8_ = auVar99._0_8_;
  auVar279._8_8_ = auVar100._0_8_;
  auVar279._0_8_ = auVar100._0_8_;
  auVar312._0_8_ = auVar123._0_8_;
  auVar312._8_8_ = auVar312._0_8_;
  auVar321._0_8_ = auVar98._0_8_;
  auVar321._8_8_ = auVar321._0_8_;
  local_78 = fVar141;
  fStack_74 = fVar141;
  fStack_70 = fVar141;
  fStack_6c = fVar141;
  fStack_68 = fVar141;
  fStack_64 = fVar141;
  fStack_60 = fVar141;
  fStack_5c = fVar141;
  fStack_90 = -fVar141;
  local_98 = -fVar141;
  fStack_94 = -fVar141;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar66 = false;
  uVar61 = 0;
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  auVar19 = vsubps_avx(auVar22,auVar21);
  auVar20 = vsubps_avx(auVar187,auVar22);
  auVar70 = vsubps_avx(auVar18,auVar187);
  auVar99 = vsubps_avx(_local_438,local_418);
  auVar100 = vsubps_avx(_local_448,auVar145);
  auVar123 = vsubps_avx(auVar165,local_428);
  auVar98 = vsubps_avx(auVar166,auVar146);
  auVar78 = ZEXT816(0x3f80000000000000);
  auVar16 = auVar78;
LAB_01296673:
  auVar260 = vshufps_avx(auVar78,auVar78,0x50);
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar335._16_4_ = 0x3f800000;
  auVar335._0_16_ = auVar331;
  auVar335._20_4_ = 0x3f800000;
  auVar335._24_4_ = 0x3f800000;
  auVar335._28_4_ = 0x3f800000;
  auVar274 = vsubps_avx(auVar331,auVar260);
  fVar94 = auVar260._0_4_;
  fVar142 = auVar180._0_4_;
  auVar79._0_4_ = fVar142 * fVar94;
  fVar96 = auVar260._4_4_;
  fVar162 = auVar180._4_4_;
  auVar79._4_4_ = fVar162 * fVar96;
  fVar144 = auVar260._8_4_;
  auVar79._8_4_ = fVar142 * fVar144;
  fVar143 = auVar260._12_4_;
  auVar79._12_4_ = fVar162 * fVar143;
  fVar200 = auVar201._0_4_;
  auVar216._0_4_ = fVar200 * fVar94;
  fVar221 = auVar201._4_4_;
  auVar216._4_4_ = fVar221 * fVar96;
  auVar216._8_4_ = fVar200 * fVar144;
  auVar216._12_4_ = fVar221 * fVar143;
  fVar222 = auVar244._0_4_;
  auVar173._0_4_ = fVar222 * fVar94;
  fVar237 = auVar244._4_4_;
  auVar173._4_4_ = fVar237 * fVar96;
  auVar173._8_4_ = fVar222 * fVar144;
  auVar173._12_4_ = fVar237 * fVar143;
  fVar163 = auVar245._0_4_;
  auVar128._0_4_ = fVar163 * fVar94;
  fVar164 = auVar245._4_4_;
  auVar128._4_4_ = fVar164 * fVar96;
  auVar128._8_4_ = fVar163 * fVar144;
  auVar128._12_4_ = fVar164 * fVar143;
  auVar299 = vfmadd231ps_fma(auVar79,auVar274,auVar251);
  auVar192 = vfmadd231ps_fma(auVar216,auVar274,auVar279);
  auVar307 = vfmadd231ps_fma(auVar173,auVar274,auVar312);
  auVar291 = vfmadd231ps_fma(auVar128,auVar321,auVar274);
  auVar260 = vmovshdup_avx(auVar16);
  fVar94 = auVar16._0_4_;
  fStack_120 = (auVar260._0_4_ - fVar94) * 0.04761905;
  auVar273._4_4_ = fVar94;
  auVar273._0_4_ = fVar94;
  auVar273._8_4_ = fVar94;
  auVar273._12_4_ = fVar94;
  auVar273._16_4_ = fVar94;
  auVar273._20_4_ = fVar94;
  auVar273._24_4_ = fVar94;
  auVar273._28_4_ = fVar94;
  auVar118._0_8_ = auVar260._0_8_;
  auVar118._8_8_ = auVar118._0_8_;
  auVar118._16_8_ = auVar118._0_8_;
  auVar118._24_8_ = auVar118._0_8_;
  auVar91 = vsubps_avx(auVar118,auVar273);
  uVar63 = auVar299._0_4_;
  auVar325._4_4_ = uVar63;
  auVar325._0_4_ = uVar63;
  auVar325._8_4_ = uVar63;
  auVar325._12_4_ = uVar63;
  auVar325._16_4_ = uVar63;
  auVar325._20_4_ = uVar63;
  auVar325._24_4_ = uVar63;
  auVar325._28_4_ = uVar63;
  auVar260 = vmovshdup_avx(auVar299);
  uVar97 = auVar260._0_8_;
  auVar318._8_8_ = uVar97;
  auVar318._0_8_ = uVar97;
  auVar318._16_8_ = uVar97;
  auVar318._24_8_ = uVar97;
  fVar223 = auVar192._0_4_;
  auVar304._4_4_ = fVar223;
  auVar304._0_4_ = fVar223;
  auVar304._8_4_ = fVar223;
  auVar304._12_4_ = fVar223;
  auVar304._16_4_ = fVar223;
  auVar304._20_4_ = fVar223;
  auVar304._24_4_ = fVar223;
  auVar304._28_4_ = fVar223;
  auVar274 = vmovshdup_avx(auVar192);
  auVar119._0_8_ = auVar274._0_8_;
  auVar119._8_8_ = auVar119._0_8_;
  auVar119._16_8_ = auVar119._0_8_;
  auVar119._24_8_ = auVar119._0_8_;
  fVar140 = auVar307._0_4_;
  auVar234._4_4_ = fVar140;
  auVar234._0_4_ = fVar140;
  auVar234._8_4_ = fVar140;
  auVar234._12_4_ = fVar140;
  auVar234._16_4_ = fVar140;
  auVar234._20_4_ = fVar140;
  auVar234._24_4_ = fVar140;
  auVar234._28_4_ = fVar140;
  auVar275 = vmovshdup_avx(auVar307);
  auVar257._0_8_ = auVar275._0_8_;
  auVar257._8_8_ = auVar257._0_8_;
  auVar257._16_8_ = auVar257._0_8_;
  auVar257._24_8_ = auVar257._0_8_;
  fVar139 = auVar291._0_4_;
  auVar276 = vmovshdup_avx(auVar291);
  auVar328 = vfmadd132ps_fma(auVar91,auVar273,_DAT_01f7b040);
  auVar91 = vsubps_avx(auVar335,ZEXT1632(auVar328));
  fVar94 = auVar328._0_4_;
  fVar96 = auVar328._4_4_;
  auVar25._4_4_ = fVar223 * fVar96;
  auVar25._0_4_ = fVar223 * fVar94;
  fVar144 = auVar328._8_4_;
  auVar25._8_4_ = fVar223 * fVar144;
  fVar143 = auVar328._12_4_;
  auVar25._12_4_ = fVar223 * fVar143;
  auVar25._16_4_ = fVar223 * 0.0;
  auVar25._20_4_ = fVar223 * 0.0;
  auVar25._24_4_ = fVar223 * 0.0;
  auVar25._28_4_ = 0x3f800000;
  auVar328 = vfmadd231ps_fma(auVar25,auVar91,auVar325);
  fVar122 = auVar274._0_4_;
  fVar138 = auVar274._4_4_;
  auVar26._4_4_ = fVar138 * fVar96;
  auVar26._0_4_ = fVar122 * fVar94;
  auVar26._8_4_ = fVar122 * fVar144;
  auVar26._12_4_ = fVar138 * fVar143;
  auVar26._16_4_ = fVar122 * 0.0;
  auVar26._20_4_ = fVar138 * 0.0;
  auVar26._24_4_ = fVar122 * 0.0;
  auVar26._28_4_ = uVar63;
  auVar332 = vfmadd231ps_fma(auVar26,auVar91,auVar318);
  auVar27._4_4_ = fVar140 * fVar96;
  auVar27._0_4_ = fVar140 * fVar94;
  auVar27._8_4_ = fVar140 * fVar144;
  auVar27._12_4_ = fVar140 * fVar143;
  auVar27._16_4_ = fVar140 * 0.0;
  auVar27._20_4_ = fVar140 * 0.0;
  auVar27._24_4_ = fVar140 * 0.0;
  auVar27._28_4_ = auVar260._4_4_;
  auVar154 = vfmadd231ps_fma(auVar27,auVar91,auVar304);
  fVar122 = auVar275._0_4_;
  fVar138 = auVar275._4_4_;
  auVar17._4_4_ = fVar138 * fVar96;
  auVar17._0_4_ = fVar122 * fVar94;
  auVar17._8_4_ = fVar122 * fVar144;
  auVar17._12_4_ = fVar138 * fVar143;
  auVar17._16_4_ = fVar122 * 0.0;
  auVar17._20_4_ = fVar138 * 0.0;
  auVar17._24_4_ = fVar122 * 0.0;
  auVar17._28_4_ = fVar223;
  auVar71 = vfmadd231ps_fma(auVar17,auVar91,auVar119);
  auVar260 = vshufps_avx(auVar299,auVar299,0xaa);
  uStack_550 = auVar260._0_8_;
  local_558 = (undefined1  [8])uStack_550;
  uStack_548 = uStack_550;
  uStack_540 = uStack_550;
  auVar274 = vshufps_avx(auVar299,auVar299,0xff);
  uStack_620 = auVar274._0_8_;
  local_628 = (undefined1  [8])uStack_620;
  uStack_618 = uStack_620;
  uStack_610 = uStack_620;
  auVar28._4_4_ = fVar139 * fVar96;
  auVar28._0_4_ = fVar139 * fVar94;
  auVar28._8_4_ = fVar139 * fVar144;
  auVar28._12_4_ = fVar139 * fVar143;
  auVar28._16_4_ = fVar139 * 0.0;
  auVar28._20_4_ = fVar139 * 0.0;
  auVar28._24_4_ = fVar139 * 0.0;
  auVar28._28_4_ = fVar139;
  auVar299 = vfmadd231ps_fma(auVar28,auVar91,auVar234);
  auVar274 = vshufps_avx(auVar192,auVar192,0xaa);
  auVar235._0_8_ = auVar274._0_8_;
  auVar235._8_8_ = auVar235._0_8_;
  auVar235._16_8_ = auVar235._0_8_;
  auVar235._24_8_ = auVar235._0_8_;
  auVar275 = vshufps_avx(auVar192,auVar192,0xff);
  uStack_500 = auVar275._0_8_;
  local_508 = (undefined1  [8])uStack_500;
  uStack_4f8 = uStack_500;
  uStack_4f0 = uStack_500;
  fVar122 = auVar276._0_4_;
  fVar138 = auVar276._4_4_;
  auVar29._4_4_ = fVar138 * fVar96;
  auVar29._0_4_ = fVar122 * fVar94;
  auVar29._8_4_ = fVar122 * fVar144;
  auVar29._12_4_ = fVar138 * fVar143;
  auVar29._16_4_ = fVar122 * 0.0;
  auVar29._20_4_ = fVar138 * 0.0;
  auVar29._24_4_ = fVar122 * 0.0;
  auVar29._28_4_ = auVar260._4_4_;
  auVar72 = vfmadd231ps_fma(auVar29,auVar91,auVar257);
  auVar30._28_4_ = fVar138;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar154._12_4_ * fVar143,
                          CONCAT48(auVar154._8_4_ * fVar144,
                                   CONCAT44(auVar154._4_4_ * fVar96,auVar154._0_4_ * fVar94))));
  auVar328 = vfmadd231ps_fma(auVar30,auVar91,ZEXT1632(auVar328));
  fVar122 = auVar275._4_4_;
  auVar31._28_4_ = fVar122;
  auVar31._0_28_ =
       ZEXT1628(CONCAT412(auVar71._12_4_ * fVar143,
                          CONCAT48(auVar71._8_4_ * fVar144,
                                   CONCAT44(auVar71._4_4_ * fVar96,auVar71._0_4_ * fVar94))));
  auVar332 = vfmadd231ps_fma(auVar31,auVar91,ZEXT1632(auVar332));
  auVar260 = vshufps_avx(auVar307,auVar307,0xaa);
  uVar97 = auVar260._0_8_;
  auVar220._8_8_ = uVar97;
  auVar220._0_8_ = uVar97;
  auVar220._16_8_ = uVar97;
  auVar220._24_8_ = uVar97;
  auVar276 = vshufps_avx(auVar307,auVar307,0xff);
  uVar97 = auVar276._0_8_;
  auVar336._8_8_ = uVar97;
  auVar336._0_8_ = uVar97;
  auVar336._16_8_ = uVar97;
  auVar336._24_8_ = uVar97;
  auVar307 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar299._12_4_ * fVar143,
                                                CONCAT48(auVar299._8_4_ * fVar144,
                                                         CONCAT44(auVar299._4_4_ * fVar96,
                                                                  auVar299._0_4_ * fVar94)))),
                             auVar91,ZEXT1632(auVar154));
  auVar299 = vshufps_avx(auVar291,auVar291,0xaa);
  auVar192 = vshufps_avx(auVar291,auVar291,0xff);
  auVar291 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar72._12_4_,
                                                CONCAT48(fVar144 * auVar72._8_4_,
                                                         CONCAT44(fVar96 * auVar72._4_4_,
                                                                  fVar94 * auVar72._0_4_)))),auVar91
                             ,ZEXT1632(auVar71));
  auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar307._12_4_,
                                                CONCAT48(fVar144 * auVar307._8_4_,
                                                         CONCAT44(fVar96 * auVar307._4_4_,
                                                                  fVar94 * auVar307._0_4_)))),
                             auVar91,ZEXT1632(auVar328));
  auVar25 = vsubps_avx(ZEXT1632(auVar307),ZEXT1632(auVar328));
  auVar307 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar291._12_4_,
                                                CONCAT48(fVar144 * auVar291._8_4_,
                                                         CONCAT44(fVar96 * auVar291._4_4_,
                                                                  fVar94 * auVar291._0_4_)))),
                             auVar91,ZEXT1632(auVar332));
  auVar26 = vsubps_avx(ZEXT1632(auVar291),ZEXT1632(auVar332));
  fStack_46c = auVar26._28_4_;
  auVar305._0_4_ = fStack_120 * auVar25._0_4_ * 3.0;
  auVar305._4_4_ = fStack_120 * auVar25._4_4_ * 3.0;
  auVar305._8_4_ = fStack_120 * auVar25._8_4_ * 3.0;
  auVar305._12_4_ = fStack_120 * auVar25._12_4_ * 3.0;
  auVar305._16_4_ = fStack_120 * auVar25._16_4_ * 3.0;
  auVar305._20_4_ = fStack_120 * auVar25._20_4_ * 3.0;
  auVar305._24_4_ = fStack_120 * auVar25._24_4_ * 3.0;
  auVar305._28_4_ = 0;
  local_488._0_4_ = fStack_120 * auVar26._0_4_ * 3.0;
  local_488._4_4_ = fStack_120 * auVar26._4_4_ * 3.0;
  fStack_480 = fStack_120 * auVar26._8_4_ * 3.0;
  fStack_47c = fStack_120 * auVar26._12_4_ * 3.0;
  fStack_478 = fStack_120 * auVar26._16_4_ * 3.0;
  fStack_474 = fStack_120 * auVar26._20_4_ * 3.0;
  fStack_470 = fStack_120 * auVar26._24_4_ * 3.0;
  fVar138 = auVar274._0_4_;
  fVar139 = auVar274._4_4_;
  auVar32._4_4_ = fVar139 * fVar96;
  auVar32._0_4_ = fVar138 * fVar94;
  auVar32._8_4_ = fVar138 * fVar144;
  auVar32._12_4_ = fVar139 * fVar143;
  auVar32._16_4_ = fVar138 * 0.0;
  auVar32._20_4_ = fVar139 * 0.0;
  auVar32._24_4_ = fVar138 * 0.0;
  auVar32._28_4_ = fStack_46c;
  auVar274 = vfmadd231ps_fma(auVar32,auVar91,_local_558);
  fVar138 = auVar275._0_4_;
  auVar258._4_4_ = fVar122 * fVar96;
  auVar258._0_4_ = fVar138 * fVar94;
  auVar258._8_4_ = fVar138 * fVar144;
  auVar258._12_4_ = fVar122 * fVar143;
  auVar258._16_4_ = fVar138 * 0.0;
  auVar258._20_4_ = fVar122 * 0.0;
  auVar258._24_4_ = fVar138 * 0.0;
  auVar258._28_4_ = 0;
  auVar275 = vfmadd231ps_fma(auVar258,auVar91,_local_628);
  fVar122 = auVar260._0_4_;
  fVar138 = auVar260._4_4_;
  auVar306._4_4_ = fVar138 * fVar96;
  auVar306._0_4_ = fVar122 * fVar94;
  auVar306._8_4_ = fVar122 * fVar144;
  auVar306._12_4_ = fVar138 * fVar143;
  auVar306._16_4_ = fVar122 * 0.0;
  auVar306._20_4_ = fVar138 * 0.0;
  auVar306._24_4_ = fVar122 * 0.0;
  auVar306._28_4_ = auVar25._28_4_;
  auVar260 = vfmadd231ps_fma(auVar306,auVar91,auVar235);
  fVar122 = auVar276._0_4_;
  fVar140 = auVar276._4_4_;
  auVar34._4_4_ = fVar140 * fVar96;
  auVar34._0_4_ = fVar122 * fVar94;
  auVar34._8_4_ = fVar122 * fVar144;
  auVar34._12_4_ = fVar140 * fVar143;
  auVar34._16_4_ = fVar122 * 0.0;
  auVar34._20_4_ = fVar140 * 0.0;
  auVar34._24_4_ = fVar122 * 0.0;
  auVar34._28_4_ = fVar139;
  auVar276 = vfmadd231ps_fma(auVar34,auVar91,_local_508);
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar154));
  fVar122 = auVar299._0_4_;
  fVar138 = auVar299._4_4_;
  auVar35._4_4_ = fVar138 * fVar96;
  auVar35._0_4_ = fVar122 * fVar94;
  auVar35._8_4_ = fVar122 * fVar144;
  auVar35._12_4_ = fVar138 * fVar143;
  auVar35._16_4_ = fVar122 * 0.0;
  auVar35._20_4_ = fVar138 * 0.0;
  auVar35._24_4_ = fVar122 * 0.0;
  auVar35._28_4_ = fVar138;
  auVar299 = vfmadd231ps_fma(auVar35,auVar91,auVar220);
  auVar29 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar307));
  fVar122 = auVar192._0_4_;
  fVar138 = auVar192._4_4_;
  auVar36._4_4_ = fVar138 * fVar96;
  auVar36._0_4_ = fVar122 * fVar94;
  auVar36._8_4_ = fVar122 * fVar144;
  auVar36._12_4_ = fVar138 * fVar143;
  auVar36._16_4_ = fVar122 * 0.0;
  auVar36._20_4_ = fVar138 * 0.0;
  auVar36._24_4_ = fVar122 * 0.0;
  auVar36._28_4_ = fVar138;
  auVar192 = vfmadd231ps_fma(auVar36,auVar91,auVar336);
  auVar37._28_4_ = fVar140;
  auVar37._0_28_ =
       ZEXT1628(CONCAT412(auVar260._12_4_ * fVar143,
                          CONCAT48(auVar260._8_4_ * fVar144,
                                   CONCAT44(auVar260._4_4_ * fVar96,auVar260._0_4_ * fVar94))));
  auVar274 = vfmadd231ps_fma(auVar37,auVar91,ZEXT1632(auVar274));
  auVar275 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar276._12_4_,
                                                CONCAT48(fVar144 * auVar276._8_4_,
                                                         CONCAT44(fVar96 * auVar276._4_4_,
                                                                  fVar94 * auVar276._0_4_)))),
                             auVar91,ZEXT1632(auVar275));
  auVar120._0_4_ = auVar154._0_4_ + auVar305._0_4_;
  auVar120._4_4_ = auVar154._4_4_ + auVar305._4_4_;
  auVar120._8_4_ = auVar154._8_4_ + auVar305._8_4_;
  auVar120._12_4_ = auVar154._12_4_ + auVar305._12_4_;
  auVar120._16_4_ = auVar305._16_4_ + 0.0;
  auVar120._20_4_ = auVar305._20_4_ + 0.0;
  auVar120._24_4_ = auVar305._24_4_ + 0.0;
  auVar120._28_4_ = 0;
  auVar260 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar299._12_4_ * fVar143,
                                                CONCAT48(auVar299._8_4_ * fVar144,
                                                         CONCAT44(auVar299._4_4_ * fVar96,
                                                                  auVar299._0_4_ * fVar94)))),
                             auVar91,ZEXT1632(auVar260));
  auVar276 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar192._12_4_ * fVar143,
                                                CONCAT48(auVar192._8_4_ * fVar144,
                                                         CONCAT44(auVar192._4_4_ * fVar96,
                                                                  auVar192._0_4_ * fVar94)))),
                             auVar91,ZEXT1632(auVar276));
  auVar299 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar260._12_4_,
                                                CONCAT48(fVar144 * auVar260._8_4_,
                                                         CONCAT44(fVar96 * auVar260._4_4_,
                                                                  fVar94 * auVar260._0_4_)))),
                             auVar91,ZEXT1632(auVar274));
  auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar276._12_4_ * fVar143,
                                                CONCAT48(auVar276._8_4_ * fVar144,
                                                         CONCAT44(auVar276._4_4_ * fVar96,
                                                                  auVar276._0_4_ * fVar94)))),
                             ZEXT1632(auVar275),auVar91);
  auVar91 = vsubps_avx(ZEXT1632(auVar260),ZEXT1632(auVar274));
  auVar25 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar275));
  auVar326._0_4_ = fStack_120 * auVar91._0_4_ * 3.0;
  auVar326._4_4_ = fStack_120 * auVar91._4_4_ * 3.0;
  auVar326._8_4_ = fStack_120 * auVar91._8_4_ * 3.0;
  auVar326._12_4_ = fStack_120 * auVar91._12_4_ * 3.0;
  auVar326._16_4_ = fStack_120 * auVar91._16_4_ * 3.0;
  auVar326._20_4_ = fStack_120 * auVar91._20_4_ * 3.0;
  auVar326._24_4_ = fStack_120 * auVar91._24_4_ * 3.0;
  auVar326._28_4_ = 0;
  local_138 = fStack_120 * auVar25._0_4_ * 3.0;
  fStack_134 = fStack_120 * auVar25._4_4_ * 3.0;
  auVar38._4_4_ = fStack_134;
  auVar38._0_4_ = local_138;
  fStack_130 = fStack_120 * auVar25._8_4_ * 3.0;
  auVar38._8_4_ = fStack_130;
  fStack_12c = fStack_120 * auVar25._12_4_ * 3.0;
  auVar38._12_4_ = fStack_12c;
  fStack_128 = fStack_120 * auVar25._16_4_ * 3.0;
  auVar38._16_4_ = fStack_128;
  fStack_124 = fStack_120 * auVar25._20_4_ * 3.0;
  auVar38._20_4_ = fStack_124;
  fStack_120 = fStack_120 * auVar25._24_4_ * 3.0;
  auVar38._24_4_ = fStack_120;
  auVar38._28_4_ = 0x40400000;
  auVar30 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar299));
  auVar31 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar192));
  auVar91 = vsubps_avx(ZEXT1632(auVar299),ZEXT1632(auVar154));
  auVar25 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar307));
  auVar26 = vsubps_avx(auVar30,auVar28);
  fVar223 = auVar91._0_4_ + auVar26._0_4_;
  fVar238 = auVar91._4_4_ + auVar26._4_4_;
  fVar239 = auVar91._8_4_ + auVar26._8_4_;
  fVar240 = auVar91._12_4_ + auVar26._12_4_;
  fVar241 = auVar91._16_4_ + auVar26._16_4_;
  fVar242 = auVar91._20_4_ + auVar26._20_4_;
  fVar243 = auVar91._24_4_ + auVar26._24_4_;
  auVar27 = vsubps_avx(auVar31,auVar29);
  auVar92._0_4_ = auVar25._0_4_ + auVar27._0_4_;
  auVar92._4_4_ = auVar25._4_4_ + auVar27._4_4_;
  auVar92._8_4_ = auVar25._8_4_ + auVar27._8_4_;
  auVar92._12_4_ = auVar25._12_4_ + auVar27._12_4_;
  auVar92._16_4_ = auVar25._16_4_ + auVar27._16_4_;
  auVar92._20_4_ = auVar25._20_4_ + auVar27._20_4_;
  auVar92._24_4_ = auVar25._24_4_ + auVar27._24_4_;
  auVar92._28_4_ = auVar25._28_4_ + auVar27._28_4_;
  local_d8 = ZEXT1632(auVar307);
  fVar94 = auVar307._0_4_;
  local_158 = (float)local_488._0_4_ + fVar94;
  fVar96 = auVar307._4_4_;
  fStack_154 = (float)local_488._4_4_ + fVar96;
  fVar144 = auVar307._8_4_;
  fStack_150 = fStack_480 + fVar144;
  fVar143 = auVar307._12_4_;
  fStack_14c = fStack_47c + fVar143;
  fStack_148 = fStack_478 + 0.0;
  fStack_144 = fStack_474 + 0.0;
  fStack_140 = fStack_470 + 0.0;
  auVar258 = ZEXT1632(auVar154);
  auVar25 = vsubps_avx(auVar258,auVar305);
  local_b8 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar25 = vsubps_avx(local_d8,_local_488);
  local_178 = vpermps_avx2(_DAT_01fb7720,auVar25);
  local_f8._0_4_ = auVar299._0_4_ + auVar326._0_4_;
  local_f8._4_4_ = auVar299._4_4_ + auVar326._4_4_;
  local_f8._8_4_ = auVar299._8_4_ + auVar326._8_4_;
  local_f8._12_4_ = auVar299._12_4_ + auVar326._12_4_;
  local_f8._16_4_ = auVar326._16_4_ + 0.0;
  local_f8._20_4_ = auVar326._20_4_ + 0.0;
  local_f8._24_4_ = auVar326._24_4_ + 0.0;
  local_f8._28_4_ = 0;
  auVar306 = ZEXT1632(auVar299);
  auVar25 = vsubps_avx(auVar306,auVar326);
  auVar32 = vpermps_avx2(_DAT_01fb7720,auVar25);
  fVar122 = auVar192._0_4_;
  local_138 = fVar122 + local_138;
  fVar138 = auVar192._4_4_;
  fStack_134 = fVar138 + fStack_134;
  fVar139 = auVar192._8_4_;
  fStack_130 = fVar139 + fStack_130;
  fVar140 = auVar192._12_4_;
  fStack_12c = fVar140 + fStack_12c;
  fStack_128 = fStack_128 + 0.0;
  fStack_124 = fStack_124 + 0.0;
  fStack_120 = fStack_120 + 0.0;
  auVar25 = vsubps_avx(ZEXT1632(auVar192),auVar38);
  local_118 = vpermps_avx2(_DAT_01fb7720,auVar25);
  auVar39._4_4_ = fVar96 * fVar238;
  auVar39._0_4_ = fVar94 * fVar223;
  auVar39._8_4_ = fVar144 * fVar239;
  auVar39._12_4_ = fVar143 * fVar240;
  auVar39._16_4_ = fVar241 * 0.0;
  auVar39._20_4_ = fVar242 * 0.0;
  auVar39._24_4_ = fVar243 * 0.0;
  auVar39._28_4_ = auVar25._28_4_;
  auVar260 = vfnmadd231ps_fma(auVar39,auVar258,auVar92);
  fStack_13c = fStack_46c + 0.0;
  auVar40._4_4_ = fStack_154 * fVar238;
  auVar40._0_4_ = local_158 * fVar223;
  auVar40._8_4_ = fStack_150 * fVar239;
  auVar40._12_4_ = fStack_14c * fVar240;
  auVar40._16_4_ = fStack_148 * fVar241;
  auVar40._20_4_ = fStack_144 * fVar242;
  auVar40._24_4_ = fStack_140 * fVar243;
  auVar40._28_4_ = 0;
  auVar274 = vfnmadd231ps_fma(auVar40,auVar92,auVar120);
  auVar41._4_4_ = local_178._4_4_ * fVar238;
  auVar41._0_4_ = local_178._0_4_ * fVar223;
  auVar41._8_4_ = local_178._8_4_ * fVar239;
  auVar41._12_4_ = local_178._12_4_ * fVar240;
  auVar41._16_4_ = local_178._16_4_ * fVar241;
  auVar41._20_4_ = local_178._20_4_ * fVar242;
  auVar41._24_4_ = local_178._24_4_ * fVar243;
  auVar41._28_4_ = fStack_46c + 0.0;
  auVar275 = vfnmadd231ps_fma(auVar41,local_b8,auVar92);
  local_628._0_4_ = auVar29._0_4_;
  local_628._4_4_ = auVar29._4_4_;
  uStack_620._0_4_ = auVar29._8_4_;
  uStack_620._4_4_ = auVar29._12_4_;
  uStack_618._0_4_ = auVar29._16_4_;
  uStack_618._4_4_ = auVar29._20_4_;
  uStack_610._0_4_ = auVar29._24_4_;
  uStack_610._4_4_ = auVar29._28_4_;
  auVar42._4_4_ = (float)local_628._4_4_ * fVar238;
  auVar42._0_4_ = (float)local_628._0_4_ * fVar223;
  auVar42._8_4_ = (float)uStack_620 * fVar239;
  auVar42._12_4_ = uStack_620._4_4_ * fVar240;
  auVar42._16_4_ = (float)uStack_618 * fVar241;
  auVar42._20_4_ = uStack_618._4_4_ * fVar242;
  auVar42._24_4_ = (float)uStack_610 * fVar243;
  auVar42._28_4_ = uStack_610._4_4_;
  auVar276 = vfnmadd231ps_fma(auVar42,auVar28,auVar92);
  auVar259._0_4_ = fVar122 * fVar223;
  auVar259._4_4_ = fVar138 * fVar238;
  auVar259._8_4_ = fVar139 * fVar239;
  auVar259._12_4_ = fVar140 * fVar240;
  auVar259._16_4_ = fVar241 * 0.0;
  auVar259._20_4_ = fVar242 * 0.0;
  auVar259._24_4_ = fVar243 * 0.0;
  auVar259._28_4_ = 0;
  auVar299 = vfnmadd231ps_fma(auVar259,auVar306,auVar92);
  uStack_11c = 0x40400000;
  auVar43._4_4_ = fStack_134 * fVar238;
  auVar43._0_4_ = local_138 * fVar223;
  auVar43._8_4_ = fStack_130 * fVar239;
  auVar43._12_4_ = fStack_12c * fVar240;
  auVar43._16_4_ = fStack_128 * fVar241;
  auVar43._20_4_ = fStack_124 * fVar242;
  auVar43._24_4_ = fStack_120 * fVar243;
  auVar43._28_4_ = auVar28._28_4_;
  auVar307 = vfnmadd231ps_fma(auVar43,local_f8,auVar92);
  auVar44._4_4_ = local_118._4_4_ * fVar238;
  auVar44._0_4_ = local_118._0_4_ * fVar223;
  auVar44._8_4_ = local_118._8_4_ * fVar239;
  auVar44._12_4_ = local_118._12_4_ * fVar240;
  auVar44._16_4_ = local_118._16_4_ * fVar241;
  auVar44._20_4_ = local_118._20_4_ * fVar242;
  auVar44._24_4_ = local_118._24_4_ * fVar243;
  auVar44._28_4_ = local_118._28_4_;
  auVar291 = vfnmadd231ps_fma(auVar44,auVar32,auVar92);
  auVar45._4_4_ = auVar31._4_4_ * fVar238;
  auVar45._0_4_ = auVar31._0_4_ * fVar223;
  auVar45._8_4_ = auVar31._8_4_ * fVar239;
  auVar45._12_4_ = auVar31._12_4_ * fVar240;
  auVar45._16_4_ = auVar31._16_4_ * fVar241;
  auVar45._20_4_ = auVar31._20_4_ * fVar242;
  auVar45._24_4_ = auVar31._24_4_ * fVar243;
  auVar45._28_4_ = auVar91._28_4_ + auVar26._28_4_;
  auVar328 = vfnmadd231ps_fma(auVar45,auVar30,auVar92);
  auVar25 = vminps_avx(ZEXT1632(auVar260),ZEXT1632(auVar274));
  auVar91 = vmaxps_avx(ZEXT1632(auVar260),ZEXT1632(auVar274));
  auVar26 = vminps_avx(ZEXT1632(auVar275),ZEXT1632(auVar276));
  auVar26 = vminps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(ZEXT1632(auVar275),ZEXT1632(auVar276));
  auVar91 = vmaxps_avx(auVar91,auVar25);
  auVar27 = vminps_avx(ZEXT1632(auVar299),ZEXT1632(auVar307));
  auVar25 = vmaxps_avx(ZEXT1632(auVar299),ZEXT1632(auVar307));
  auVar17 = vminps_avx(ZEXT1632(auVar291),ZEXT1632(auVar328));
  auVar27 = vminps_avx(auVar27,auVar17);
  auVar27 = vminps_avx(auVar26,auVar27);
  auVar26 = vmaxps_avx(ZEXT1632(auVar291),ZEXT1632(auVar328));
  auVar25 = vmaxps_avx(auVar25,auVar26);
  auVar25 = vmaxps_avx(auVar91,auVar25);
  auVar54._4_4_ = fStack_74;
  auVar54._0_4_ = local_78;
  auVar54._8_4_ = fStack_70;
  auVar54._12_4_ = fStack_6c;
  auVar54._16_4_ = fStack_68;
  auVar54._20_4_ = fStack_64;
  auVar54._24_4_ = fStack_60;
  auVar54._28_4_ = fStack_5c;
  auVar91 = vcmpps_avx(auVar27,auVar54,2);
  auVar53._4_4_ = fStack_94;
  auVar53._0_4_ = local_98;
  auVar53._8_4_ = fStack_90;
  auVar53._12_4_ = fStack_8c;
  auVar53._16_4_ = fStack_88;
  auVar53._20_4_ = fStack_84;
  auVar53._24_4_ = fStack_80;
  auVar53._28_4_ = fStack_7c;
  auVar25 = vcmpps_avx(auVar25,auVar53,5);
  auVar91 = vandps_avx(auVar25,auVar91);
  auVar25 = local_198 & auVar91;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar25 = vsubps_avx(auVar28,auVar258);
    auVar26 = vsubps_avx(auVar30,auVar306);
    fVar238 = auVar25._0_4_ + auVar26._0_4_;
    fVar239 = auVar25._4_4_ + auVar26._4_4_;
    fVar240 = auVar25._8_4_ + auVar26._8_4_;
    fVar241 = auVar25._12_4_ + auVar26._12_4_;
    fVar242 = auVar25._16_4_ + auVar26._16_4_;
    fVar243 = auVar25._20_4_ + auVar26._20_4_;
    fVar95 = auVar25._24_4_ + auVar26._24_4_;
    auVar27 = vsubps_avx(auVar29,local_d8);
    auVar17 = vsubps_avx(auVar31,ZEXT1632(auVar192));
    auVar121._0_4_ = auVar27._0_4_ + auVar17._0_4_;
    auVar121._4_4_ = auVar27._4_4_ + auVar17._4_4_;
    auVar121._8_4_ = auVar27._8_4_ + auVar17._8_4_;
    auVar121._12_4_ = auVar27._12_4_ + auVar17._12_4_;
    auVar121._16_4_ = auVar27._16_4_ + auVar17._16_4_;
    auVar121._20_4_ = auVar27._20_4_ + auVar17._20_4_;
    auVar121._24_4_ = auVar27._24_4_ + auVar17._24_4_;
    fVar223 = auVar17._28_4_;
    auVar121._28_4_ = auVar27._28_4_ + fVar223;
    auVar46._4_4_ = fVar96 * fVar239;
    auVar46._0_4_ = fVar94 * fVar238;
    auVar46._8_4_ = fVar144 * fVar240;
    auVar46._12_4_ = fVar143 * fVar241;
    auVar46._16_4_ = fVar242 * 0.0;
    auVar46._20_4_ = fVar243 * 0.0;
    auVar46._24_4_ = fVar95 * 0.0;
    auVar46._28_4_ = auVar31._28_4_;
    auVar299 = vfnmadd231ps_fma(auVar46,auVar121,auVar258);
    auVar47._4_4_ = fVar239 * fStack_154;
    auVar47._0_4_ = fVar238 * local_158;
    auVar47._8_4_ = fVar240 * fStack_150;
    auVar47._12_4_ = fVar241 * fStack_14c;
    auVar47._16_4_ = fVar242 * fStack_148;
    auVar47._20_4_ = fVar243 * fStack_144;
    auVar47._24_4_ = fVar95 * fStack_140;
    auVar47._28_4_ = 0;
    auVar260 = vfnmadd213ps_fma(auVar120,auVar121,auVar47);
    auVar48._4_4_ = fVar239 * local_178._4_4_;
    auVar48._0_4_ = fVar238 * local_178._0_4_;
    auVar48._8_4_ = fVar240 * local_178._8_4_;
    auVar48._12_4_ = fVar241 * local_178._12_4_;
    auVar48._16_4_ = fVar242 * local_178._16_4_;
    auVar48._20_4_ = fVar243 * local_178._20_4_;
    auVar48._24_4_ = fVar95 * local_178._24_4_;
    auVar48._28_4_ = 0;
    auVar274 = vfnmadd213ps_fma(local_b8,auVar121,auVar48);
    auVar49._4_4_ = (float)local_628._4_4_ * fVar239;
    auVar49._0_4_ = (float)local_628._0_4_ * fVar238;
    auVar49._8_4_ = (float)uStack_620 * fVar240;
    auVar49._12_4_ = uStack_620._4_4_ * fVar241;
    auVar49._16_4_ = (float)uStack_618 * fVar242;
    auVar49._20_4_ = uStack_618._4_4_ * fVar243;
    auVar49._24_4_ = (float)uStack_610 * fVar95;
    auVar49._28_4_ = 0;
    auVar192 = vfnmadd231ps_fma(auVar49,auVar121,auVar28);
    auVar160._0_4_ = fVar122 * fVar238;
    auVar160._4_4_ = fVar138 * fVar239;
    auVar160._8_4_ = fVar139 * fVar240;
    auVar160._12_4_ = fVar140 * fVar241;
    auVar160._16_4_ = fVar242 * 0.0;
    auVar160._20_4_ = fVar243 * 0.0;
    auVar160._24_4_ = fVar95 * 0.0;
    auVar160._28_4_ = 0;
    auVar307 = vfnmadd231ps_fma(auVar160,auVar121,auVar306);
    auVar50._4_4_ = fVar239 * fStack_134;
    auVar50._0_4_ = fVar238 * local_138;
    auVar50._8_4_ = fVar240 * fStack_130;
    auVar50._12_4_ = fVar241 * fStack_12c;
    auVar50._16_4_ = fVar242 * fStack_128;
    auVar50._20_4_ = fVar243 * fStack_124;
    auVar50._24_4_ = fVar95 * fStack_120;
    auVar50._28_4_ = fVar223;
    auVar275 = vfnmadd213ps_fma(local_f8,auVar121,auVar50);
    auVar51._4_4_ = fVar239 * local_118._4_4_;
    auVar51._0_4_ = fVar238 * local_118._0_4_;
    auVar51._8_4_ = fVar240 * local_118._8_4_;
    auVar51._12_4_ = fVar241 * local_118._12_4_;
    auVar51._16_4_ = fVar242 * local_118._16_4_;
    auVar51._20_4_ = fVar243 * local_118._20_4_;
    auVar51._24_4_ = fVar95 * local_118._24_4_;
    auVar51._28_4_ = fVar223;
    auVar276 = vfnmadd213ps_fma(auVar32,auVar121,auVar51);
    auVar52._4_4_ = fVar239 * auVar31._4_4_;
    auVar52._0_4_ = fVar238 * auVar31._0_4_;
    auVar52._8_4_ = fVar240 * auVar31._8_4_;
    auVar52._12_4_ = fVar241 * auVar31._12_4_;
    auVar52._16_4_ = fVar242 * auVar31._16_4_;
    auVar52._20_4_ = fVar243 * auVar31._20_4_;
    auVar52._24_4_ = fVar95 * auVar31._24_4_;
    auVar52._28_4_ = auVar25._28_4_ + auVar26._28_4_;
    auVar291 = vfnmadd231ps_fma(auVar52,auVar121,auVar30);
    auVar26 = vminps_avx(ZEXT1632(auVar299),ZEXT1632(auVar260));
    auVar25 = vmaxps_avx(ZEXT1632(auVar299),ZEXT1632(auVar260));
    auVar27 = vminps_avx(ZEXT1632(auVar274),ZEXT1632(auVar192));
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar274),ZEXT1632(auVar192));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar17 = vminps_avx(ZEXT1632(auVar307),ZEXT1632(auVar275));
    auVar26 = vmaxps_avx(ZEXT1632(auVar307),ZEXT1632(auVar275));
    auVar28 = vminps_avx(ZEXT1632(auVar276),ZEXT1632(auVar291));
    auVar17 = vminps_avx(auVar17,auVar28);
    auVar17 = vminps_avx(auVar27,auVar17);
    auVar27 = vmaxps_avx(ZEXT1632(auVar276),ZEXT1632(auVar291));
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar17,auVar54,2);
    auVar26 = vcmpps_avx(auVar26,auVar53,5);
    auVar25 = vandps_avx(auVar26,auVar25);
    auVar91 = vandps_avx(auVar91,local_198);
    auVar26 = auVar91 & auVar25;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar91 = vandps_avx(auVar25,auVar91);
      uVar60 = vmovmskps_avx(auVar91);
      if (uVar60 != 0) {
        mask_stack[uVar61] = uVar60 & 0xff;
        BVar6 = (BBox1f)vmovlps_avx(auVar16);
        cu_stack[uVar61] = BVar6;
        BVar6 = (BBox1f)vmovlps_avx(auVar78);
        cv_stack[uVar61] = BVar6;
        uVar61 = (ulong)((int)uVar61 + 1);
      }
    }
  }
LAB_01296c24:
  if ((int)uVar61 != 0) {
    uVar56 = (int)uVar61 - 1;
    uVar60 = mask_stack[uVar56];
    fVar94 = cu_stack[uVar56].lower;
    fVar96 = cu_stack[uVar56].upper;
    iVar33 = 0;
    for (uVar62 = (ulong)uVar60; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      iVar33 = iVar33 + 1;
    }
    uVar60 = uVar60 - 1 & uVar60;
    if (uVar60 == 0) {
      uVar61 = (ulong)uVar56;
    }
    auVar78._8_8_ = 0;
    auVar78._0_4_ = cv_stack[uVar56].lower;
    auVar78._4_4_ = cv_stack[uVar56].upper;
    mask_stack[uVar56] = uVar60;
    fVar144 = (float)(iVar33 + 1) * 0.14285715;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * (float)iVar33 * 0.14285715)),
                              ZEXT416((uint)fVar94),
                              ZEXT416((uint)(1.0 - (float)iVar33 * 0.14285715)));
    auVar260 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar144)),ZEXT416((uint)fVar94),
                               ZEXT416((uint)(1.0 - fVar144)));
    fVar96 = auVar260._0_4_;
    auVar236._0_4_ = auVar16._0_4_;
    fVar94 = fVar96 - auVar236._0_4_;
    if (fVar94 < 0.16666667) {
      auVar274 = vshufps_avx(auVar78,auVar78,0x50);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar275 = vsubps_avx(auVar108,auVar274);
      fVar144 = auVar274._0_4_;
      auVar174._0_4_ = fVar144 * fVar142;
      fVar143 = auVar274._4_4_;
      auVar174._4_4_ = fVar143 * fVar162;
      fVar122 = auVar274._8_4_;
      auVar174._8_4_ = fVar122 * fVar142;
      fVar138 = auVar274._12_4_;
      auVar174._12_4_ = fVar138 * fVar162;
      auVar190._0_4_ = fVar144 * fVar200;
      auVar190._4_4_ = fVar143 * fVar221;
      auVar190._8_4_ = fVar122 * fVar200;
      auVar190._12_4_ = fVar138 * fVar221;
      auVar217._0_4_ = fVar144 * fVar222;
      auVar217._4_4_ = fVar143 * fVar237;
      auVar217._8_4_ = fVar122 * fVar222;
      auVar217._12_4_ = fVar138 * fVar237;
      auVar80._0_4_ = fVar144 * fVar163;
      auVar80._4_4_ = fVar143 * fVar164;
      auVar80._8_4_ = fVar122 * fVar163;
      auVar80._12_4_ = fVar138 * fVar164;
      auVar274 = vfmadd231ps_fma(auVar174,auVar275,auVar251);
      auVar276 = vfmadd231ps_fma(auVar190,auVar275,auVar279);
      auVar299 = vfmadd231ps_fma(auVar217,auVar275,auVar312);
      auVar275 = vfmadd231ps_fma(auVar80,auVar275,auVar321);
      auVar161._16_16_ = auVar274;
      auVar161._0_16_ = auVar274;
      auVar179._16_16_ = auVar276;
      auVar179._0_16_ = auVar276;
      auVar199._16_16_ = auVar299;
      auVar199._0_16_ = auVar299;
      auVar236._4_4_ = auVar236._0_4_;
      auVar236._8_4_ = auVar236._0_4_;
      auVar236._12_4_ = auVar236._0_4_;
      auVar236._20_4_ = fVar96;
      auVar236._16_4_ = fVar96;
      auVar236._24_4_ = fVar96;
      auVar236._28_4_ = fVar96;
      auVar91 = vsubps_avx(auVar179,auVar161);
      auVar276 = vfmadd213ps_fma(auVar91,auVar236,auVar161);
      auVar91 = vsubps_avx(auVar199,auVar179);
      auVar192 = vfmadd213ps_fma(auVar91,auVar236,auVar179);
      auVar274 = vsubps_avx(auVar275,auVar299);
      auVar93._16_16_ = auVar274;
      auVar93._0_16_ = auVar274;
      auVar274 = vfmadd213ps_fma(auVar93,auVar236,auVar199);
      auVar91 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar276));
      auVar275 = vfmadd213ps_fma(auVar91,auVar236,ZEXT1632(auVar276));
      auVar91 = vsubps_avx(ZEXT1632(auVar274),ZEXT1632(auVar192));
      auVar274 = vfmadd213ps_fma(auVar91,auVar236,ZEXT1632(auVar192));
      auVar91 = vsubps_avx(ZEXT1632(auVar274),ZEXT1632(auVar275));
      auVar328 = vfmadd231ps_fma(ZEXT1632(auVar275),auVar91,auVar236);
      fVar144 = fVar94 * 0.33333334;
      auVar231._0_8_ =
           CONCAT44(auVar328._4_4_ + fVar144 * auVar91._4_4_ * 3.0,
                    auVar328._0_4_ + fVar144 * auVar91._0_4_ * 3.0);
      auVar231._8_4_ = auVar328._8_4_ + fVar144 * auVar91._8_4_ * 3.0;
      auVar231._12_4_ = auVar328._12_4_ + fVar144 * auVar91._12_4_ * 3.0;
      auVar275 = vshufpd_avx(auVar328,auVar328,3);
      auVar276 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar274 = vsubps_avx(auVar275,auVar328);
      auVar299 = vsubps_avx(auVar276,(undefined1  [16])0x0);
      auVar81._0_4_ = auVar274._0_4_ + auVar299._0_4_;
      auVar81._4_4_ = auVar274._4_4_ + auVar299._4_4_;
      auVar81._8_4_ = auVar274._8_4_ + auVar299._8_4_;
      auVar81._12_4_ = auVar274._12_4_ + auVar299._12_4_;
      auVar274 = vshufps_avx(auVar328,auVar328,0xb1);
      auVar299 = vshufps_avx(auVar231,auVar231,0xb1);
      auVar322._4_4_ = auVar81._0_4_;
      auVar322._0_4_ = auVar81._0_4_;
      auVar322._8_4_ = auVar81._0_4_;
      auVar322._12_4_ = auVar81._0_4_;
      auVar192 = vshufps_avx(auVar81,auVar81,0x55);
      fVar143 = auVar192._0_4_;
      auVar82._0_4_ = fVar143 * auVar274._0_4_;
      fVar122 = auVar192._4_4_;
      auVar82._4_4_ = fVar122 * auVar274._4_4_;
      fVar138 = auVar192._8_4_;
      auVar82._8_4_ = fVar138 * auVar274._8_4_;
      fVar139 = auVar192._12_4_;
      auVar82._12_4_ = fVar139 * auVar274._12_4_;
      auVar191._0_4_ = fVar143 * auVar299._0_4_;
      auVar191._4_4_ = fVar122 * auVar299._4_4_;
      auVar191._8_4_ = fVar138 * auVar299._8_4_;
      auVar191._12_4_ = fVar139 * auVar299._12_4_;
      auVar307 = vfmadd231ps_fma(auVar82,auVar322,auVar328);
      auVar291 = vfmadd231ps_fma(auVar191,auVar322,auVar231);
      auVar299 = vshufps_avx(auVar307,auVar307,0xe8);
      auVar192 = vshufps_avx(auVar291,auVar291,0xe8);
      auVar274 = vcmpps_avx(auVar299,auVar192,1);
      uVar60 = vextractps_avx(auVar274,0);
      auVar332 = auVar291;
      if ((uVar60 & 1) == 0) {
        auVar332 = auVar307;
      }
      auVar153._0_4_ = fVar144 * auVar91._16_4_ * 3.0;
      auVar153._4_4_ = fVar144 * auVar91._20_4_ * 3.0;
      auVar153._8_4_ = fVar144 * auVar91._24_4_ * 3.0;
      auVar153._12_4_ = fVar144 * 0.0;
      auVar73 = vsubps_avx((undefined1  [16])0x0,auVar153);
      auVar154 = vshufps_avx(auVar73,auVar73,0xb1);
      auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar232._0_4_ = fVar143 * auVar154._0_4_;
      auVar232._4_4_ = fVar122 * auVar154._4_4_;
      auVar232._8_4_ = fVar138 * auVar154._8_4_;
      auVar232._12_4_ = fVar139 * auVar154._12_4_;
      auVar252._0_4_ = auVar71._0_4_ * fVar143;
      auVar252._4_4_ = auVar71._4_4_ * fVar122;
      auVar252._8_4_ = auVar71._8_4_ * fVar138;
      auVar252._12_4_ = auVar71._12_4_ * fVar139;
      auVar74 = vfmadd231ps_fma(auVar232,auVar322,auVar73);
      auVar75 = vfmadd231ps_fma(auVar252,(undefined1  [16])0x0,auVar322);
      auVar71 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar72 = vshufps_avx(auVar75,auVar75,0xe8);
      auVar154 = vcmpps_avx(auVar71,auVar72,1);
      uVar60 = vextractps_avx(auVar154,0);
      auVar76 = auVar75;
      if ((uVar60 & 1) == 0) {
        auVar76 = auVar74;
      }
      auVar332 = vmaxss_avx(auVar76,auVar332);
      auVar299 = vminps_avx(auVar299,auVar192);
      auVar192 = vminps_avx(auVar71,auVar72);
      auVar192 = vminps_avx(auVar299,auVar192);
      auVar274 = vshufps_avx(auVar274,auVar274,0x55);
      auVar274 = vblendps_avx(auVar274,auVar154,2);
      auVar154 = vpslld_avx(auVar274,0x1f);
      auVar274 = vshufpd_avx(auVar291,auVar291,1);
      auVar274 = vinsertps_avx(auVar274,auVar75,0x9c);
      auVar299 = vshufpd_avx(auVar307,auVar307,1);
      auVar299 = vinsertps_avx(auVar299,auVar74,0x9c);
      auVar274 = vblendvps_avx(auVar299,auVar274,auVar154);
      auVar299 = vmovshdup_avx(auVar274);
      auVar274 = vmaxss_avx(auVar299,auVar274);
      fVar138 = auVar192._0_4_;
      auVar299 = vmovshdup_avx(auVar192);
      fVar122 = auVar274._0_4_;
      fVar144 = auVar299._0_4_;
      fVar143 = auVar332._0_4_;
      if (((0.0001 <= fVar138) || (fVar122 <= -0.0001)) && (0.0001 <= fVar144 || fVar122 <= -0.0001)
         ) goto code_r0x01296f2f;
      goto LAB_01296f55;
    }
    auVar16 = vinsertps_avx(auVar16,auVar260,0x10);
    goto LAB_01296673;
  }
  if (bVar66) goto LAB_01297ad9;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar63;
  auVar90._0_4_ = uVar63;
  auVar90._8_4_ = uVar63;
  auVar90._12_4_ = uVar63;
  auVar16 = vcmpps_avx(auVar224,auVar90,2);
  uVar57 = vmovmskps_avx(auVar16);
  uVar58 = (ulong)((uint)uVar58 & (uint)uVar58 + 0xf & uVar57);
  goto LAB_012959ed;
code_r0x01296f2f:
  auVar299 = vcmpps_avx(auVar299,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar307 = vcmpps_avx(auVar192,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar299 = vandps_avx(auVar307,auVar299);
  if (fVar143 <= -0.0001 || (auVar299 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01296c24;
LAB_01296f55:
  auVar307 = vcmpps_avx(auVar192,_DAT_01f45a50,1);
  auVar291 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar299 = vcmpss_avx(auVar332,ZEXT816(0) << 0x20,1);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar129._8_4_ = 0xbf800000;
  auVar129._0_8_ = 0xbf800000bf800000;
  auVar129._12_4_ = 0xbf800000;
  auVar299 = vblendvps_avx(auVar109,auVar129,auVar299);
  auVar307 = vblendvps_avx(auVar109,auVar129,auVar307);
  fVar140 = auVar307._0_4_;
  fVar139 = auVar299._0_4_;
  auVar299 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar140 == fVar139) && (!NAN(fVar140) && !NAN(fVar139))) {
    auVar299 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar140 == fVar139) && (!NAN(fVar140) && !NAN(fVar139))) {
    auVar291 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar307 = vmovshdup_avx(auVar307);
  fVar223 = auVar307._0_4_;
  if ((fVar140 != fVar223) || (NAN(fVar140) || NAN(fVar223))) {
    if ((fVar144 != fVar138) || (NAN(fVar144) || NAN(fVar138))) {
      auVar155._0_8_ = auVar192._0_8_ ^ 0x8000000080000000;
      auVar155._8_4_ = auVar192._8_4_ ^ 0x80000000;
      auVar155._12_4_ = auVar192._12_4_ ^ 0x80000000;
      auVar156._0_4_ = -fVar138 / (fVar144 - fVar138);
      auVar156._4_12_ = auVar155._4_12_;
      auVar192 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
      auVar307 = auVar192;
    }
    else {
      auVar192 = ZEXT816(0) << 0x20;
      if ((fVar138 != 0.0) || (auVar307 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar138))) {
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
        auVar307 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar299 = vminss_avx(auVar299,auVar192);
    auVar291 = vmaxss_avx(auVar307,auVar291);
  }
  auVar274 = vcmpss_avx(auVar274,ZEXT416(0),1);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar130._8_4_ = 0xbf800000;
  auVar130._0_8_ = 0xbf800000bf800000;
  auVar130._12_4_ = 0xbf800000;
  auVar274 = vblendvps_avx(auVar110,auVar130,auVar274);
  fVar144 = auVar274._0_4_;
  if ((fVar139 != fVar144) || (NAN(fVar139) || NAN(fVar144))) {
    if ((fVar122 != fVar143) || (NAN(fVar122) || NAN(fVar143))) {
      auVar83._0_8_ = auVar332._0_8_ ^ 0x8000000080000000;
      auVar83._8_4_ = auVar332._8_4_ ^ 0x80000000;
      auVar83._12_4_ = auVar332._12_4_ ^ 0x80000000;
      auVar157._0_4_ = -fVar143 / (fVar122 - fVar143);
      auVar157._4_12_ = auVar83._4_12_;
      auVar274 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar157._0_4_)),auVar157,ZEXT416(0));
      auVar192 = auVar274;
    }
    else {
      auVar274 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar143 != 0.0) || (auVar192 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar143))) {
        auVar274 = SUB6416(ZEXT464(0xff800000),0);
        auVar192 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar299 = vminss_avx(auVar299,auVar192);
    auVar291 = vmaxss_avx(auVar274,auVar291);
  }
  if ((fVar223 != fVar144) || (NAN(fVar223) || NAN(fVar144))) {
    auVar299 = vminss_avx(auVar299,SUB6416(ZEXT464(0x3f800000),0));
    auVar291 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar291);
  }
  auVar274 = vmaxss_avx(ZEXT816(0) << 0x40,auVar299);
  auVar299 = vminss_avx(auVar291,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar299._0_4_ < auVar274._0_4_) goto LAB_01296c24;
  auVar274 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar274._0_4_ + -0.1)));
  auVar299 = vminss_avx(ZEXT416((uint)(auVar299._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar175._0_8_ = auVar328._0_8_;
  auVar175._8_8_ = auVar175._0_8_;
  auVar266._8_8_ = auVar231._0_8_;
  auVar266._0_8_ = auVar231._0_8_;
  auVar280._8_8_ = auVar73._0_8_;
  auVar280._0_8_ = auVar73._0_8_;
  auVar192 = vshufpd_avx(auVar231,auVar231,3);
  auVar307 = vshufpd_avx(auVar73,auVar73,3);
  auVar291 = vshufps_avx(auVar274,auVar299,0);
  auVar84._8_4_ = 0x3f800000;
  auVar84._0_8_ = 0x3f8000003f800000;
  auVar84._12_4_ = 0x3f800000;
  auVar328 = vsubps_avx(auVar84,auVar291);
  local_4e8 = auVar275._0_4_;
  fStack_4e4 = auVar275._4_4_;
  fStack_4e0 = auVar275._8_4_;
  fStack_4dc = auVar275._12_4_;
  fVar144 = auVar291._0_4_;
  auVar85._0_4_ = fVar144 * local_4e8;
  fVar143 = auVar291._4_4_;
  auVar85._4_4_ = fVar143 * fStack_4e4;
  fVar122 = auVar291._8_4_;
  auVar85._8_4_ = fVar122 * fStack_4e0;
  fVar138 = auVar291._12_4_;
  auVar85._12_4_ = fVar138 * fStack_4dc;
  auVar218._0_4_ = fVar144 * auVar192._0_4_;
  auVar218._4_4_ = fVar143 * auVar192._4_4_;
  auVar218._8_4_ = fVar122 * auVar192._8_4_;
  auVar218._12_4_ = fVar138 * auVar192._12_4_;
  auVar233._0_4_ = fVar144 * auVar307._0_4_;
  auVar233._4_4_ = fVar143 * auVar307._4_4_;
  auVar233._8_4_ = fVar122 * auVar307._8_4_;
  auVar233._12_4_ = fVar138 * auVar307._12_4_;
  local_528 = auVar276._0_4_;
  fStack_524 = auVar276._4_4_;
  fStack_520 = auVar276._8_4_;
  fStack_51c = auVar276._12_4_;
  auVar253._0_4_ = fVar144 * local_528;
  auVar253._4_4_ = fVar143 * fStack_524;
  auVar253._8_4_ = fVar122 * fStack_520;
  auVar253._12_4_ = fVar138 * fStack_51c;
  auVar192 = vfmadd231ps_fma(auVar85,auVar328,auVar175);
  auVar307 = vfmadd231ps_fma(auVar218,auVar328,auVar266);
  auVar291 = vfmadd231ps_fma(auVar233,auVar328,auVar280);
  auVar328 = vfmadd231ps_fma(auVar253,auVar328,ZEXT816(0));
  auVar275 = vmovshdup_avx(auVar78);
  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar275._0_4_ * auVar274._0_4_)),auVar78,
                            ZEXT416((uint)(1.0 - auVar274._0_4_)));
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar275._0_4_ * auVar299._0_4_)),auVar78,
                            ZEXT416((uint)(1.0 - auVar299._0_4_)));
  fVar144 = 1.0 / fVar94;
  auVar274 = vsubps_avx(auVar307,auVar192);
  auVar267._0_4_ = auVar274._0_4_ * 3.0;
  auVar267._4_4_ = auVar274._4_4_ * 3.0;
  auVar267._8_4_ = auVar274._8_4_ * 3.0;
  auVar267._12_4_ = auVar274._12_4_ * 3.0;
  auVar274 = vsubps_avx(auVar291,auVar307);
  auVar281._0_4_ = auVar274._0_4_ * 3.0;
  auVar281._4_4_ = auVar274._4_4_ * 3.0;
  auVar281._8_4_ = auVar274._8_4_ * 3.0;
  auVar281._12_4_ = auVar274._12_4_ * 3.0;
  auVar274 = vsubps_avx(auVar328,auVar291);
  auVar292._0_4_ = auVar274._0_4_ * 3.0;
  auVar292._4_4_ = auVar274._4_4_ * 3.0;
  auVar292._8_4_ = auVar274._8_4_ * 3.0;
  auVar292._12_4_ = auVar274._12_4_ * 3.0;
  auVar275 = vminps_avx(auVar281,auVar292);
  auVar274 = vmaxps_avx(auVar281,auVar292);
  auVar275 = vminps_avx(auVar267,auVar275);
  auVar274 = vmaxps_avx(auVar267,auVar274);
  auVar276 = vshufpd_avx(auVar275,auVar275,3);
  auVar299 = vshufpd_avx(auVar274,auVar274,3);
  auVar275 = vminps_avx(auVar275,auVar276);
  auVar274 = vmaxps_avx(auVar274,auVar299);
  auVar282._0_4_ = auVar275._0_4_ * fVar144;
  auVar282._4_4_ = auVar275._4_4_ * fVar144;
  auVar282._8_4_ = auVar275._8_4_ * fVar144;
  auVar282._12_4_ = auVar275._12_4_ * fVar144;
  auVar268._0_4_ = auVar274._0_4_ * fVar144;
  auVar268._4_4_ = auVar274._4_4_ * fVar144;
  auVar268._8_4_ = auVar274._8_4_ * fVar144;
  auVar268._12_4_ = auVar274._12_4_ * fVar144;
  fVar144 = 1.0 / (auVar73._0_4_ - auVar72._0_4_);
  auVar274 = vshufpd_avx(auVar192,auVar192,3);
  auVar275 = vshufpd_avx(auVar307,auVar307,3);
  auVar276 = vshufpd_avx(auVar291,auVar291,3);
  auVar299 = vshufpd_avx(auVar328,auVar328,3);
  auVar274 = vsubps_avx(auVar274,auVar192);
  auVar192 = vsubps_avx(auVar275,auVar307);
  auVar307 = vsubps_avx(auVar276,auVar291);
  auVar299 = vsubps_avx(auVar299,auVar328);
  auVar275 = vminps_avx(auVar274,auVar192);
  auVar274 = vmaxps_avx(auVar274,auVar192);
  auVar276 = vminps_avx(auVar307,auVar299);
  auVar276 = vminps_avx(auVar275,auVar276);
  auVar275 = vmaxps_avx(auVar307,auVar299);
  auVar274 = vmaxps_avx(auVar274,auVar275);
  auVar313._0_4_ = fVar144 * auVar276._0_4_;
  auVar313._4_4_ = fVar144 * auVar276._4_4_;
  auVar313._8_4_ = fVar144 * auVar276._8_4_;
  auVar313._12_4_ = fVar144 * auVar276._12_4_;
  auVar300._0_4_ = fVar144 * auVar274._0_4_;
  auVar300._4_4_ = fVar144 * auVar274._4_4_;
  auVar300._8_4_ = fVar144 * auVar274._8_4_;
  auVar300._12_4_ = fVar144 * auVar274._12_4_;
  auVar299 = vinsertps_avx(auVar16,auVar72,0x10);
  auVar192 = vinsertps_avx(auVar260,auVar73,0x10);
  auVar293._0_4_ = (auVar299._0_4_ + auVar192._0_4_) * 0.5;
  auVar293._4_4_ = (auVar299._4_4_ + auVar192._4_4_) * 0.5;
  auVar293._8_4_ = (auVar299._8_4_ + auVar192._8_4_) * 0.5;
  auVar293._12_4_ = (auVar299._12_4_ + auVar192._12_4_) * 0.5;
  auVar86._4_4_ = auVar293._0_4_;
  auVar86._0_4_ = auVar293._0_4_;
  auVar86._8_4_ = auVar293._0_4_;
  auVar86._12_4_ = auVar293._0_4_;
  auVar274 = vfmadd213ps_fma(auVar19,auVar86,auVar21);
  auVar275 = vfmadd213ps_fma(auVar20,auVar86,auVar22);
  auVar276 = vfmadd213ps_fma(auVar70,auVar86,auVar187);
  auVar260 = vsubps_avx(auVar275,auVar274);
  auVar274 = vfmadd213ps_fma(auVar260,auVar86,auVar274);
  auVar260 = vsubps_avx(auVar276,auVar275);
  auVar260 = vfmadd213ps_fma(auVar260,auVar86,auVar275);
  auVar260 = vsubps_avx(auVar260,auVar274);
  auVar274 = vfmadd231ps_fma(auVar274,auVar260,auVar86);
  auVar87._0_8_ = CONCAT44(auVar260._4_4_ * 3.0,auVar260._0_4_ * 3.0);
  auVar87._8_4_ = auVar260._8_4_ * 3.0;
  auVar87._12_4_ = auVar260._12_4_ * 3.0;
  auVar323._8_8_ = auVar274._0_8_;
  auVar323._0_8_ = auVar274._0_8_;
  auVar260 = vshufpd_avx(auVar274,auVar274,3);
  auVar274 = vshufps_avx(auVar293,auVar293,0x55);
  auVar291 = vsubps_avx(auVar260,auVar323);
  auVar78 = vfmadd231ps_fma(auVar323,auVar274,auVar291);
  auVar333._8_8_ = auVar87._0_8_;
  auVar333._0_8_ = auVar87._0_8_;
  auVar260 = vshufpd_avx(auVar87,auVar87,3);
  auVar260 = vsubps_avx(auVar260,auVar333);
  auVar328 = vfmadd213ps_fma(auVar260,auVar274,auVar333);
  auVar274 = vmovshdup_avx(auVar328);
  auVar334._0_8_ = auVar274._0_8_ ^ 0x8000000080000000;
  auVar334._8_4_ = auVar274._8_4_ ^ 0x80000000;
  auVar334._12_4_ = auVar274._12_4_ ^ 0x80000000;
  auVar275 = vmovshdup_avx(auVar291);
  auVar260 = vunpcklps_avx(auVar275,auVar334);
  auVar276 = vshufps_avx(auVar260,auVar334,4);
  auVar307 = vshufps_avx(auVar293,auVar293,0x54);
  auVar158._0_8_ = auVar291._0_8_ ^ 0x8000000080000000;
  auVar158._8_4_ = auVar291._8_4_ ^ 0x80000000;
  auVar158._12_4_ = auVar291._12_4_ ^ 0x80000000;
  auVar260 = vmovlhps_avx(auVar158,auVar328);
  auVar260 = vshufps_avx(auVar260,auVar328,8);
  auVar274 = vfmsub231ss_fma(ZEXT416((uint)(auVar291._0_4_ * auVar274._0_4_)),auVar275,auVar328);
  uVar63 = auVar274._0_4_;
  auVar88._4_4_ = uVar63;
  auVar88._0_4_ = uVar63;
  auVar88._8_4_ = uVar63;
  auVar88._12_4_ = uVar63;
  auVar274 = vdivps_avx(auVar276,auVar88);
  auVar275 = vdivps_avx(auVar260,auVar88);
  fVar122 = auVar78._0_4_;
  fVar144 = auVar274._0_4_;
  auVar260 = vshufps_avx(auVar78,auVar78,0x55);
  fVar143 = auVar275._0_4_;
  auVar89._0_4_ = fVar122 * fVar144 + auVar260._0_4_ * fVar143;
  auVar89._4_4_ = fVar122 * auVar274._4_4_ + auVar260._4_4_ * auVar275._4_4_;
  auVar89._8_4_ = fVar122 * auVar274._8_4_ + auVar260._8_4_ * auVar275._8_4_;
  auVar89._12_4_ = fVar122 * auVar274._12_4_ + auVar260._12_4_ * auVar275._12_4_;
  auVar71 = vsubps_avx(auVar307,auVar89);
  auVar307 = vmovshdup_avx(auVar274);
  auVar260 = vinsertps_avx(auVar282,auVar313,0x1c);
  auVar193._0_4_ = auVar307._0_4_ * auVar260._0_4_;
  auVar193._4_4_ = auVar307._4_4_ * auVar260._4_4_;
  auVar193._8_4_ = auVar307._8_4_ * auVar260._8_4_;
  auVar193._12_4_ = auVar307._12_4_ * auVar260._12_4_;
  auVar276 = vinsertps_avx(auVar268,auVar300,0x1c);
  auVar111._0_4_ = auVar276._0_4_ * auVar307._0_4_;
  auVar111._4_4_ = auVar276._4_4_ * auVar307._4_4_;
  auVar111._8_4_ = auVar276._8_4_ * auVar307._8_4_;
  auVar111._12_4_ = auVar276._12_4_ * auVar307._12_4_;
  auVar78 = vminps_avx(auVar193,auVar111);
  auVar328 = vmaxps_avx(auVar111,auVar193);
  auVar307 = vinsertps_avx(auVar313,auVar282,0x4c);
  auVar332 = vmovshdup_avx(auVar275);
  auVar291 = vinsertps_avx(auVar300,auVar268,0x4c);
  auVar301._0_4_ = auVar332._0_4_ * auVar307._0_4_;
  auVar301._4_4_ = auVar332._4_4_ * auVar307._4_4_;
  auVar301._8_4_ = auVar332._8_4_ * auVar307._8_4_;
  auVar301._12_4_ = auVar332._12_4_ * auVar307._12_4_;
  auVar283._0_4_ = auVar332._0_4_ * auVar291._0_4_;
  auVar283._4_4_ = auVar332._4_4_ * auVar291._4_4_;
  auVar283._8_4_ = auVar332._8_4_ * auVar291._8_4_;
  auVar283._12_4_ = auVar332._12_4_ * auVar291._12_4_;
  auVar332 = vminps_avx(auVar301,auVar283);
  auVar314._0_4_ = auVar78._0_4_ + auVar332._0_4_;
  auVar314._4_4_ = auVar78._4_4_ + auVar332._4_4_;
  auVar314._8_4_ = auVar78._8_4_ + auVar332._8_4_;
  auVar314._12_4_ = auVar78._12_4_ + auVar332._12_4_;
  auVar78 = vmaxps_avx(auVar283,auVar301);
  auVar112._0_4_ = auVar78._0_4_ + auVar328._0_4_;
  auVar112._4_4_ = auVar78._4_4_ + auVar328._4_4_;
  auVar112._8_4_ = auVar78._8_4_ + auVar328._8_4_;
  auVar112._12_4_ = auVar78._12_4_ + auVar328._12_4_;
  auVar284._8_8_ = 0x3f80000000000000;
  auVar284._0_8_ = 0x3f80000000000000;
  auVar328 = vsubps_avx(auVar284,auVar112);
  auVar78 = vsubps_avx(auVar284,auVar314);
  auVar332 = vsubps_avx(auVar299,auVar293);
  auVar154 = vsubps_avx(auVar192,auVar293);
  auVar131._0_4_ = fVar144 * auVar260._0_4_;
  auVar131._4_4_ = fVar144 * auVar260._4_4_;
  auVar131._8_4_ = fVar144 * auVar260._8_4_;
  auVar131._12_4_ = fVar144 * auVar260._12_4_;
  auVar315._0_4_ = fVar144 * auVar276._0_4_;
  auVar315._4_4_ = fVar144 * auVar276._4_4_;
  auVar315._8_4_ = fVar144 * auVar276._8_4_;
  auVar315._12_4_ = fVar144 * auVar276._12_4_;
  auVar276 = vminps_avx(auVar131,auVar315);
  auVar260 = vmaxps_avx(auVar315,auVar131);
  auVar194._0_4_ = fVar143 * auVar307._0_4_;
  auVar194._4_4_ = fVar143 * auVar307._4_4_;
  auVar194._8_4_ = fVar143 * auVar307._8_4_;
  auVar194._12_4_ = fVar143 * auVar307._12_4_;
  auVar269._0_4_ = fVar143 * auVar291._0_4_;
  auVar269._4_4_ = fVar143 * auVar291._4_4_;
  auVar269._8_4_ = fVar143 * auVar291._8_4_;
  auVar269._12_4_ = fVar143 * auVar291._12_4_;
  auVar307 = vminps_avx(auVar194,auVar269);
  auVar316._0_4_ = auVar276._0_4_ + auVar307._0_4_;
  auVar316._4_4_ = auVar276._4_4_ + auVar307._4_4_;
  auVar316._8_4_ = auVar276._8_4_ + auVar307._8_4_;
  auVar316._12_4_ = auVar276._12_4_ + auVar307._12_4_;
  fVar223 = auVar332._0_4_;
  auVar324._0_4_ = fVar223 * auVar328._0_4_;
  fVar238 = auVar332._4_4_;
  auVar324._4_4_ = fVar238 * auVar328._4_4_;
  fVar239 = auVar332._8_4_;
  auVar324._8_4_ = fVar239 * auVar328._8_4_;
  fVar240 = auVar332._12_4_;
  auVar324._12_4_ = fVar240 * auVar328._12_4_;
  auVar276 = vmaxps_avx(auVar269,auVar194);
  auVar270._0_4_ = fVar223 * auVar78._0_4_;
  auVar270._4_4_ = fVar238 * auVar78._4_4_;
  auVar270._8_4_ = fVar239 * auVar78._8_4_;
  auVar270._12_4_ = fVar240 * auVar78._12_4_;
  fVar122 = auVar154._0_4_;
  auVar113._0_4_ = fVar122 * auVar328._0_4_;
  fVar138 = auVar154._4_4_;
  auVar113._4_4_ = fVar138 * auVar328._4_4_;
  fVar139 = auVar154._8_4_;
  auVar113._8_4_ = fVar139 * auVar328._8_4_;
  fVar140 = auVar154._12_4_;
  auVar113._12_4_ = fVar140 * auVar328._12_4_;
  auVar285._0_4_ = fVar122 * auVar78._0_4_;
  auVar285._4_4_ = fVar138 * auVar78._4_4_;
  auVar285._8_4_ = fVar139 * auVar78._8_4_;
  auVar285._12_4_ = fVar140 * auVar78._12_4_;
  auVar132._0_4_ = auVar260._0_4_ + auVar276._0_4_;
  auVar132._4_4_ = auVar260._4_4_ + auVar276._4_4_;
  auVar132._8_4_ = auVar260._8_4_ + auVar276._8_4_;
  auVar132._12_4_ = auVar260._12_4_ + auVar276._12_4_;
  auVar195._8_8_ = 0x3f800000;
  auVar195._0_8_ = 0x3f800000;
  auVar260 = vsubps_avx(auVar195,auVar132);
  auVar276 = vsubps_avx(auVar195,auVar316);
  auVar317._0_4_ = fVar223 * auVar260._0_4_;
  auVar317._4_4_ = fVar238 * auVar260._4_4_;
  auVar317._8_4_ = fVar239 * auVar260._8_4_;
  auVar317._12_4_ = fVar240 * auVar260._12_4_;
  auVar302._0_4_ = fVar223 * auVar276._0_4_;
  auVar302._4_4_ = fVar238 * auVar276._4_4_;
  auVar302._8_4_ = fVar239 * auVar276._8_4_;
  auVar302._12_4_ = fVar240 * auVar276._12_4_;
  auVar133._0_4_ = fVar122 * auVar260._0_4_;
  auVar133._4_4_ = fVar138 * auVar260._4_4_;
  auVar133._8_4_ = fVar139 * auVar260._8_4_;
  auVar133._12_4_ = fVar140 * auVar260._12_4_;
  auVar196._0_4_ = fVar122 * auVar276._0_4_;
  auVar196._4_4_ = fVar138 * auVar276._4_4_;
  auVar196._8_4_ = fVar139 * auVar276._8_4_;
  auVar196._12_4_ = fVar140 * auVar276._12_4_;
  auVar260 = vminps_avx(auVar317,auVar302);
  auVar276 = vminps_avx(auVar133,auVar196);
  auVar260 = vminps_avx(auVar260,auVar276);
  auVar276 = vmaxps_avx(auVar302,auVar317);
  auVar307 = vmaxps_avx(auVar196,auVar133);
  auVar291 = vminps_avx(auVar324,auVar270);
  auVar328 = vminps_avx(auVar113,auVar285);
  auVar291 = vminps_avx(auVar291,auVar328);
  auVar260 = vhaddps_avx(auVar260,auVar291);
  auVar276 = vmaxps_avx(auVar307,auVar276);
  auVar307 = vmaxps_avx(auVar270,auVar324);
  auVar291 = vmaxps_avx(auVar285,auVar113);
  auVar307 = vmaxps_avx(auVar291,auVar307);
  auVar276 = vhaddps_avx(auVar276,auVar307);
  auVar260 = vshufps_avx(auVar260,auVar260,0xe8);
  auVar276 = vshufps_avx(auVar276,auVar276,0xe8);
  auVar286._0_4_ = auVar71._0_4_ + auVar260._0_4_;
  auVar286._4_4_ = auVar71._4_4_ + auVar260._4_4_;
  auVar286._8_4_ = auVar71._8_4_ + auVar260._8_4_;
  auVar286._12_4_ = auVar71._12_4_ + auVar260._12_4_;
  auVar271._0_4_ = auVar71._0_4_ + auVar276._0_4_;
  auVar271._4_4_ = auVar71._4_4_ + auVar276._4_4_;
  auVar271._8_4_ = auVar71._8_4_ + auVar276._8_4_;
  auVar271._12_4_ = auVar71._12_4_ + auVar276._12_4_;
  auVar260 = vmaxps_avx(auVar299,auVar286);
  auVar276 = vminps_avx(auVar271,auVar192);
  auVar260 = vcmpps_avx(auVar276,auVar260,1);
  auVar260 = vshufps_avx(auVar260,auVar260,0x50);
  if ((auVar260 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar260[0xf] < '\0')
  goto LAB_01296c24;
  bVar59 = 0;
  if ((auVar236._0_4_ < auVar286._0_4_) && (bVar59 = 0, auVar271._0_4_ < auVar192._0_4_)) {
    auVar276 = vmovshdup_avx(auVar286);
    auVar260 = vcmpps_avx(auVar271,auVar192,1);
    bVar59 = auVar260[4] & auVar72._0_4_ < auVar276._0_4_;
  }
  p03.field_0.i[0] = auVar18._0_4_;
  p03.field_0.i[1] = auVar18._4_4_;
  p03.field_0.i[2] = auVar18._8_4_;
  p03.field_0.i[3] = auVar18._12_4_;
  if (((3 < (uint)uVar61 || fVar94 < 0.001) | bVar59) == 1) {
    lVar64 = 0xc9;
    do {
      lVar64 = lVar64 + -1;
      if (lVar64 == 0) goto LAB_01296c24;
      fVar138 = auVar71._0_4_;
      fVar122 = 1.0 - fVar138;
      fVar94 = fVar122 * fVar122 * fVar122;
      fVar96 = fVar138 * 3.0 * fVar122 * fVar122;
      fVar122 = fVar122 * fVar138 * fVar138 * 3.0;
      auVar176._4_4_ = fVar94;
      auVar176._0_4_ = fVar94;
      auVar176._8_4_ = fVar94;
      auVar176._12_4_ = fVar94;
      auVar134._4_4_ = fVar96;
      auVar134._0_4_ = fVar96;
      auVar134._8_4_ = fVar96;
      auVar134._12_4_ = fVar96;
      auVar114._4_4_ = fVar122;
      auVar114._0_4_ = fVar122;
      auVar114._8_4_ = fVar122;
      auVar114._12_4_ = fVar122;
      fVar138 = fVar138 * fVar138 * fVar138;
      auVar197._0_4_ = p03.field_0.v[0] * fVar138;
      auVar197._4_4_ = p03.field_0.v[1] * fVar138;
      auVar197._8_4_ = p03.field_0.v[2] * fVar138;
      auVar197._12_4_ = p03.field_0.v[3] * fVar138;
      auVar16 = vfmadd231ps_fma(auVar197,auVar187,auVar114);
      auVar16 = vfmadd231ps_fma(auVar16,auVar22,auVar134);
      auVar16 = vfmadd231ps_fma(auVar16,auVar21,auVar176);
      auVar115._8_8_ = auVar16._0_8_;
      auVar115._0_8_ = auVar16._0_8_;
      auVar16 = vshufpd_avx(auVar16,auVar16,3);
      auVar260 = vshufps_avx(auVar71,auVar71,0x55);
      auVar16 = vsubps_avx(auVar16,auVar115);
      auVar260 = vfmadd213ps_fma(auVar16,auVar260,auVar115);
      fVar94 = auVar260._0_4_;
      auVar16 = vshufps_avx(auVar260,auVar260,0x55);
      auVar116._0_4_ = fVar144 * fVar94 + fVar143 * auVar16._0_4_;
      auVar116._4_4_ = auVar274._4_4_ * fVar94 + auVar275._4_4_ * auVar16._4_4_;
      auVar116._8_4_ = auVar274._8_4_ * fVar94 + auVar275._8_4_ * auVar16._8_4_;
      auVar116._12_4_ = auVar274._12_4_ * fVar94 + auVar275._12_4_ * auVar16._12_4_;
      auVar71 = vsubps_avx(auVar71,auVar116);
      auVar16 = vandps_avx(local_3e8,auVar260);
      auVar260 = vshufps_avx(auVar16,auVar16,0xf5);
      auVar16 = vmaxss_avx(auVar260,auVar16);
    } while (fVar141 <= auVar16._0_4_);
    local_1f8 = auVar71._0_4_;
    if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
      auVar16 = vmovshdup_avx(auVar71);
      fVar94 = auVar16._0_4_;
      if ((0.0 <= fVar94) && (fVar94 <= 1.0)) {
        auVar16 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar307 = vinsertps_avx(auVar16,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar16 = vdpps_avx(auVar307,local_3f8,0x7f);
        auVar260 = vdpps_avx(auVar307,local_408,0x7f);
        auVar274 = vdpps_avx(auVar307,auVar184,0x7f);
        auVar275 = vdpps_avx(auVar307,auVar23,0x7f);
        auVar276 = vdpps_avx(auVar307,auVar24,0x7f);
        auVar299 = vdpps_avx(auVar307,auVar124,0x7f);
        auVar192 = vdpps_avx(auVar307,auVar148,0x7f);
        auVar307 = vdpps_avx(auVar307,auVar69,0x7f);
        fVar96 = 1.0 - fVar94;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar94 * auVar276._0_4_)),ZEXT416((uint)fVar96),
                                  auVar16);
        auVar260 = vfmadd231ss_fma(ZEXT416((uint)(auVar299._0_4_ * fVar94)),ZEXT416((uint)fVar96),
                                   auVar260);
        auVar274 = vfmadd231ss_fma(ZEXT416((uint)(auVar192._0_4_ * fVar94)),ZEXT416((uint)fVar96),
                                   auVar274);
        auVar275 = vfmadd231ss_fma(ZEXT416((uint)(fVar94 * auVar307._0_4_)),ZEXT416((uint)fVar96),
                                   auVar275);
        fVar143 = 1.0 - local_1f8;
        fVar94 = fVar143 * local_1f8 * local_1f8 * 3.0;
        fVar138 = local_1f8 * local_1f8 * local_1f8;
        auVar274 = vfmadd231ss_fma(ZEXT416((uint)(auVar275._0_4_ * fVar138)),ZEXT416((uint)fVar94),
                                   auVar274);
        fVar96 = local_1f8 * 3.0 * fVar143 * fVar143;
        auVar260 = vfmadd231ss_fma(auVar274,ZEXT416((uint)fVar96),auVar260);
        fVar144 = fVar143 * fVar143 * fVar143;
        auVar16 = vfmadd231ss_fma(auVar260,ZEXT416((uint)fVar144),auVar16);
        fVar122 = auVar16._0_4_;
        if ((fVar68 <= fVar122) && (fVar139 = *(float *)(ray + k * 4 + 0x80), fVar122 <= fVar139)) {
          pGVar9 = (context->scene->geometries).items[uVar57].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar67 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar67 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1e8 = vshufps_avx(auVar71,auVar71,0x55);
            auVar254._8_4_ = 0x3f800000;
            auVar254._0_8_ = 0x3f8000003f800000;
            auVar254._12_4_ = 0x3f800000;
            auVar16 = vsubps_avx(auVar254,local_1e8);
            fVar140 = local_1e8._0_4_;
            auVar272._0_4_ = fVar140 * (float)local_438._0_4_;
            fVar223 = local_1e8._4_4_;
            auVar272._4_4_ = fVar223 * (float)local_438._4_4_;
            fVar238 = local_1e8._8_4_;
            auVar272._8_4_ = fVar238 * fStack_430;
            fVar239 = local_1e8._12_4_;
            auVar272._12_4_ = fVar239 * fStack_42c;
            auVar287._0_4_ = fVar140 * (float)local_448._0_4_;
            auVar287._4_4_ = fVar223 * (float)local_448._4_4_;
            auVar287._8_4_ = fVar238 * fStack_440;
            auVar287._12_4_ = fVar239 * fStack_43c;
            local_4b8 = auVar165._0_4_;
            fStack_4b4 = auVar165._4_4_;
            fStack_4b0 = auVar165._8_4_;
            fStack_4ac = auVar165._12_4_;
            auVar294._0_4_ = fVar140 * local_4b8;
            auVar294._4_4_ = fVar223 * fStack_4b4;
            auVar294._8_4_ = fVar238 * fStack_4b0;
            auVar294._12_4_ = fVar239 * fStack_4ac;
            local_4c8 = auVar166._0_4_;
            fStack_4c4 = auVar166._4_4_;
            fStack_4c0 = auVar166._8_4_;
            fStack_4bc = auVar166._12_4_;
            auVar303._0_4_ = fVar140 * local_4c8;
            auVar303._4_4_ = fVar223 * fStack_4c4;
            auVar303._8_4_ = fVar238 * fStack_4c0;
            auVar303._12_4_ = fVar239 * fStack_4bc;
            auVar260 = vfmadd231ps_fma(auVar272,auVar16,local_418);
            auVar274 = vfmadd231ps_fma(auVar287,auVar16,auVar145);
            auVar275 = vfmadd231ps_fma(auVar294,auVar16,local_428);
            auVar276 = vfmadd231ps_fma(auVar303,auVar16,auVar146);
            auVar16 = vsubps_avx(auVar274,auVar260);
            auVar260 = vsubps_avx(auVar275,auVar274);
            auVar274 = vsubps_avx(auVar276,auVar275);
            auVar295._0_4_ = auVar260._0_4_ * local_1f8;
            auVar295._4_4_ = auVar260._4_4_ * local_1f8;
            auVar295._8_4_ = auVar260._8_4_ * local_1f8;
            auVar295._12_4_ = auVar260._12_4_ * local_1f8;
            auVar219._4_4_ = fVar143;
            auVar219._0_4_ = fVar143;
            auVar219._8_4_ = fVar143;
            auVar219._12_4_ = fVar143;
            auVar16 = vfmadd231ps_fma(auVar295,auVar219,auVar16);
            auVar255._0_4_ = auVar274._0_4_ * local_1f8;
            auVar255._4_4_ = auVar274._4_4_ * local_1f8;
            auVar255._8_4_ = auVar274._8_4_ * local_1f8;
            auVar255._12_4_ = auVar274._12_4_ * local_1f8;
            auVar260 = vfmadd231ps_fma(auVar255,auVar219,auVar260);
            auVar256._0_4_ = auVar260._0_4_ * local_1f8;
            auVar256._4_4_ = auVar260._4_4_ * local_1f8;
            auVar256._8_4_ = auVar260._8_4_ * local_1f8;
            auVar256._12_4_ = auVar260._12_4_ * local_1f8;
            auVar260 = vfmadd231ps_fma(auVar256,auVar219,auVar16);
            local_378 = auVar98._0_4_;
            fStack_374 = auVar98._4_4_;
            fStack_370 = auVar98._8_4_;
            fStack_36c = auVar98._12_4_;
            auVar198._0_4_ = fVar138 * local_378;
            auVar198._4_4_ = fVar138 * fStack_374;
            auVar198._8_4_ = fVar138 * fStack_370;
            auVar198._12_4_ = fVar138 * fStack_36c;
            auVar135._4_4_ = fVar94;
            auVar135._0_4_ = fVar94;
            auVar135._8_4_ = fVar94;
            auVar135._12_4_ = fVar94;
            auVar16 = vfmadd132ps_fma(auVar135,auVar198,auVar123);
            auVar177._4_4_ = fVar96;
            auVar177._0_4_ = fVar96;
            auVar177._8_4_ = fVar96;
            auVar177._12_4_ = fVar96;
            auVar16 = vfmadd132ps_fma(auVar177,auVar16,auVar100);
            auVar136._0_4_ = auVar260._0_4_ * 3.0;
            auVar136._4_4_ = auVar260._4_4_ * 3.0;
            auVar136._8_4_ = auVar260._8_4_ * 3.0;
            auVar136._12_4_ = auVar260._12_4_ * 3.0;
            auVar159._4_4_ = fVar144;
            auVar159._0_4_ = fVar144;
            auVar159._8_4_ = fVar144;
            auVar159._12_4_ = fVar144;
            auVar260 = vfmadd132ps_fma(auVar159,auVar16,auVar99);
            auVar16 = vshufps_avx(auVar136,auVar136,0xc9);
            auVar178._0_4_ = auVar260._0_4_ * auVar16._0_4_;
            auVar178._4_4_ = auVar260._4_4_ * auVar16._4_4_;
            auVar178._8_4_ = auVar260._8_4_ * auVar16._8_4_;
            auVar178._12_4_ = auVar260._12_4_ * auVar16._12_4_;
            auVar16 = vshufps_avx(auVar260,auVar260,0xc9);
            auVar260 = vfmsub231ps_fma(auVar178,auVar136,auVar16);
            auVar16 = vshufps_avx(auVar260,auVar260,0x55);
            local_228[0] = (RTCHitN)auVar16[0];
            local_228[1] = (RTCHitN)auVar16[1];
            local_228[2] = (RTCHitN)auVar16[2];
            local_228[3] = (RTCHitN)auVar16[3];
            local_228[4] = (RTCHitN)auVar16[4];
            local_228[5] = (RTCHitN)auVar16[5];
            local_228[6] = (RTCHitN)auVar16[6];
            local_228[7] = (RTCHitN)auVar16[7];
            local_228[8] = (RTCHitN)auVar16[8];
            local_228[9] = (RTCHitN)auVar16[9];
            local_228[10] = (RTCHitN)auVar16[10];
            local_228[0xb] = (RTCHitN)auVar16[0xb];
            local_228[0xc] = (RTCHitN)auVar16[0xc];
            local_228[0xd] = (RTCHitN)auVar16[0xd];
            local_228[0xe] = (RTCHitN)auVar16[0xe];
            local_228[0xf] = (RTCHitN)auVar16[0xf];
            local_218 = vshufps_avx(auVar260,auVar260,0xaa);
            local_208 = auVar260._0_4_;
            uStack_204 = local_208;
            uStack_200 = local_208;
            uStack_1fc = local_208;
            fStack_1f4 = local_1f8;
            fStack_1f0 = local_1f8;
            fStack_1ec = local_1f8;
            local_1d8 = CONCAT44(uVar8,uVar8);
            uStack_1d0 = CONCAT44(uVar8,uVar8);
            local_1c8._4_4_ = uVar57;
            local_1c8._0_4_ = uVar57;
            local_1c8._8_4_ = uVar57;
            local_1c8._12_4_ = uVar57;
            vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
            uStack_1b4 = context->user->instID[0];
            local_1b8 = uStack_1b4;
            uStack_1b0 = uStack_1b4;
            uStack_1ac = uStack_1b4;
            uStack_1a8 = context->user->instPrimID[0];
            uStack_1a4 = uStack_1a8;
            uStack_1a0 = uStack_1a8;
            uStack_19c = uStack_1a8;
            *(float *)(ray + k * 4 + 0x80) = fVar122;
            local_468 = *local_458;
            args.valid = (int *)local_468;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_228;
            args.N = 4;
            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->occlusionFilterN)(&args);
            }
            if (local_468 == (undefined1  [16])0x0) {
              auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar16 = auVar16 ^ _DAT_01f46b70;
            }
            else {
              p_Var15 = context->args->filter;
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var15)(&args);
              }
              auVar260 = vpcmpeqd_avx(local_468,_DAT_01f45a50);
              auVar16 = auVar260 ^ _DAT_01f46b70;
              auVar137._8_4_ = 0xff800000;
              auVar137._0_8_ = 0xff800000ff800000;
              auVar137._12_4_ = 0xff800000;
              auVar260 = vblendvps_avx(auVar137,*(undefined1 (*) [16])(args.ray + 0x80),auVar260);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar260;
            }
            auVar117._8_8_ = 0x100000001;
            auVar117._0_8_ = 0x100000001;
            bVar67 = (auVar117 & auVar16) != (undefined1  [16])0x0;
            if (!bVar67) {
              *(float *)(ray + k * 4 + 0x80) = fVar139;
            }
          }
          bVar66 = (bool)(bVar66 | bVar67);
        }
      }
    }
    goto LAB_01296c24;
  }
  auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar96),0x10);
  auVar78 = vinsertps_avx(auVar72,ZEXT416((uint)auVar73._0_4_),0x10);
  goto LAB_01296673;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }